

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  uint uVar49;
  uint uVar50;
  uint uVar51;
  ulong uVar52;
  long lVar54;
  byte bVar55;
  uint uVar56;
  ulong uVar57;
  uint uVar58;
  float fVar59;
  undefined4 uVar60;
  float fVar61;
  float fVar91;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar92;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined8 uVar94;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar144;
  float fVar161;
  float fVar162;
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar163;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  vfloat4 a0_3;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  float fVar178;
  float fVar192;
  float fVar193;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar194;
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar220;
  vfloat4 a0_1;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [64];
  float fVar233;
  float fVar243;
  float fVar244;
  undefined1 auVar234 [16];
  float fVar245;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  vfloat4 a0;
  undefined1 auVar247 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar274 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_53c;
  undefined1 local_538 [16];
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  long local_4b0;
  Primitive *local_4a8;
  ulong local_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  uint local_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [32];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  RTCFilterFunctionNArguments local_368;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 auStack_328 [16];
  undefined1 local_318 [32];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  uint auStack_2c8 [4];
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2ac;
  uint local_2a4;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  uint uStack_198;
  float afStack_194 [7];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar53;
  undefined1 auVar273 [32];
  
  PVar3 = prim[1];
  uVar57 = (ulong)(byte)PVar3;
  fVar59 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  auVar62._0_4_ = fVar59 * auVar12._0_4_;
  auVar62._4_4_ = fVar59 * auVar12._4_4_;
  auVar62._8_4_ = fVar59 * auVar12._8_4_;
  auVar62._12_4_ = fVar59 * auVar12._12_4_;
  auVar145._0_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar145._4_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar145._8_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar145._12_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar57 + 6)));
  auVar247 = vcvtdq2ps_avx(auVar247);
  uVar52 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + uVar57 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar52 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar263._4_4_ = auVar145._0_4_;
  auVar263._0_4_ = auVar145._0_4_;
  auVar263._8_4_ = auVar145._0_4_;
  auVar263._12_4_ = auVar145._0_4_;
  auVar96 = vshufps_avx(auVar145,auVar145,0x55);
  auVar63 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar59 = auVar63._0_4_;
  auVar234._0_4_ = fVar59 * auVar127._0_4_;
  fVar91 = auVar63._4_4_;
  auVar234._4_4_ = fVar91 * auVar127._4_4_;
  fVar120 = auVar63._8_4_;
  auVar234._8_4_ = fVar120 * auVar127._8_4_;
  fVar92 = auVar63._12_4_;
  auVar234._12_4_ = fVar92 * auVar127._12_4_;
  auVar221._0_4_ = auVar247._0_4_ * fVar59;
  auVar221._4_4_ = auVar247._4_4_ * fVar91;
  auVar221._8_4_ = auVar247._8_4_ * fVar120;
  auVar221._12_4_ = auVar247._12_4_ * fVar92;
  auVar195._0_4_ = auVar237._0_4_ * fVar59;
  auVar195._4_4_ = auVar237._4_4_ * fVar91;
  auVar195._8_4_ = auVar237._8_4_ * fVar120;
  auVar195._12_4_ = auVar237._12_4_ * fVar92;
  auVar63 = vfmadd231ps_fma(auVar234,auVar96,auVar9);
  auVar124 = vfmadd231ps_fma(auVar221,auVar96,auVar11);
  auVar96 = vfmadd231ps_fma(auVar195,auVar64,auVar96);
  auVar121 = vfmadd231ps_fma(auVar63,auVar263,auVar12);
  auVar124 = vfmadd231ps_fma(auVar124,auVar263,auVar10);
  auVar134 = vfmadd231ps_fma(auVar96,auVar65,auVar263);
  auVar264._4_4_ = auVar62._0_4_;
  auVar264._0_4_ = auVar62._0_4_;
  auVar264._8_4_ = auVar62._0_4_;
  auVar264._12_4_ = auVar62._0_4_;
  auVar96 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar63._0_4_;
  auVar146._0_4_ = fVar59 * auVar127._0_4_;
  fVar91 = auVar63._4_4_;
  auVar146._4_4_ = fVar91 * auVar127._4_4_;
  fVar120 = auVar63._8_4_;
  auVar146._8_4_ = fVar120 * auVar127._8_4_;
  fVar92 = auVar63._12_4_;
  auVar146._12_4_ = fVar92 * auVar127._12_4_;
  auVar95._0_4_ = auVar247._0_4_ * fVar59;
  auVar95._4_4_ = auVar247._4_4_ * fVar91;
  auVar95._8_4_ = auVar247._8_4_ * fVar120;
  auVar95._12_4_ = auVar247._12_4_ * fVar92;
  auVar63._0_4_ = auVar237._0_4_ * fVar59;
  auVar63._4_4_ = auVar237._4_4_ * fVar91;
  auVar63._8_4_ = auVar237._8_4_ * fVar120;
  auVar63._12_4_ = auVar237._12_4_ * fVar92;
  auVar9 = vfmadd231ps_fma(auVar146,auVar96,auVar9);
  auVar127 = vfmadd231ps_fma(auVar95,auVar96,auVar11);
  auVar11 = vfmadd231ps_fma(auVar63,auVar96,auVar64);
  auVar247 = vfmadd231ps_fma(auVar9,auVar264,auVar12);
  auVar64 = vfmadd231ps_fma(auVar127,auVar264,auVar10);
  auVar237 = vfmadd231ps_fma(auVar11,auVar264,auVar65);
  local_2f8._8_4_ = 0x7fffffff;
  local_2f8._0_8_ = 0x7fffffff7fffffff;
  local_2f8._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar121,local_2f8);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar133,1);
  auVar9 = vblendvps_avx(auVar121,auVar133,auVar12);
  auVar12 = vandps_avx(auVar124,local_2f8);
  auVar12 = vcmpps_avx(auVar12,auVar133,1);
  auVar127 = vblendvps_avx(auVar124,auVar133,auVar12);
  auVar12 = vandps_avx(auVar134,local_2f8);
  auVar12 = vcmpps_avx(auVar12,auVar133,1);
  auVar12 = vblendvps_avx(auVar134,auVar133,auVar12);
  auVar10 = vrcpps_avx(auVar9);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar179);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar127);
  auVar127 = vfnmadd213ps_fma(auVar127,auVar9,auVar179);
  auVar11 = vfmadd132ps_fma(auVar127,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar9,auVar179);
  auVar65 = vfmadd132ps_fma(auVar12,auVar9,auVar9);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar247);
  auVar134._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar134._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar134._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar134._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar247);
  auVar147._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar147._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar147._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar147._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar3;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar127);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar57 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar64);
  auVar196._0_4_ = auVar12._0_4_ * auVar11._0_4_;
  auVar196._4_4_ = auVar12._4_4_ * auVar11._4_4_;
  auVar196._8_4_ = auVar12._8_4_ * auVar11._8_4_;
  auVar196._12_4_ = auVar12._12_4_ * auVar11._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar12,auVar64);
  auVar96._0_4_ = auVar11._0_4_ * auVar12._0_4_;
  auVar96._4_4_ = auVar11._4_4_ * auVar12._4_4_;
  auVar96._8_4_ = auVar11._8_4_ * auVar12._8_4_;
  auVar96._12_4_ = auVar11._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar52 + uVar57 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar237);
  auVar121._0_4_ = auVar65._0_4_ * auVar12._0_4_;
  auVar121._4_4_ = auVar65._4_4_ * auVar12._4_4_;
  auVar121._8_4_ = auVar65._8_4_ * auVar12._8_4_;
  auVar121._12_4_ = auVar65._12_4_ * auVar12._12_4_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar247);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar237);
  auVar64._0_4_ = auVar65._0_4_ * auVar12._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar12._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar12._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar134,auVar147);
  auVar9 = vpminsd_avx(auVar196,auVar96);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vpminsd_avx(auVar121,auVar64);
  uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar206._4_4_ = uVar60;
  auVar206._0_4_ = uVar60;
  auVar206._8_4_ = uVar60;
  auVar206._12_4_ = uVar60;
  auVar9 = vmaxps_avx(auVar9,auVar206);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  local_288._0_4_ = auVar12._0_4_ * 0.99999964;
  local_288._4_4_ = auVar12._4_4_ * 0.99999964;
  local_288._8_4_ = auVar12._8_4_ * 0.99999964;
  local_288._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar134,auVar147);
  auVar9 = vpmaxsd_avx(auVar196,auVar96);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar9 = vpmaxsd_avx(auVar121,auVar64);
  fVar59 = (ray->super_RayK<1>).tfar;
  auVar237._4_4_ = fVar59;
  auVar237._0_4_ = fVar59;
  auVar237._8_4_ = fVar59;
  auVar237._12_4_ = fVar59;
  auVar9 = vminps_avx(auVar9,auVar237);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar65._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar124[4] = PVar3;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar3;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar3;
  auVar124._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar124,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_288,auVar65,2);
  auVar12 = vandps_avx(auVar12,auVar9);
  uVar49 = vmovmskps_avx(auVar12);
  if (uVar49 == 0) {
    return;
  }
  uVar49 = uVar49 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_3f8 = 0x80000000;
  uStack_3f4 = 0x80000000;
  uStack_3f0 = 0x80000000;
  uStack_3ec = 0x80000000;
  do {
    lVar54 = 0;
    for (uVar52 = (ulong)uVar49; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      lVar54 = lVar54 + 1;
    }
    uVar51 = *(uint *)(prim + 2);
    pGVar4 = (context->scene->geometries).items[uVar51].ptr;
    local_4a0 = (ulong)*(uint *)(prim + lVar54 * 4 + 6);
    lVar5 = *(long *)&pGVar4[1].time_range.upper;
    uVar52 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                             (ulong)*(uint *)(prim + lVar54 * 4 + 6) *
                             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    auVar12 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar52);
    lVar54 = uVar52 + 1;
    auVar9 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar54);
    _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar127 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar52);
    auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar54);
    auVar66._8_4_ = 0x3eaaaaab;
    auVar66._0_8_ = 0x3eaaaaab3eaaaaab;
    auVar66._12_4_ = 0x3eaaaaab;
    auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar4[2].intersectionFilterN +
                               (long)pGVar4[2].pointQueryFunc * uVar52),auVar12,auVar66);
    auVar237 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar4[2].intersectionFilterN +
                                 (long)pGVar4[2].pointQueryFunc * lVar54),auVar9,auVar66);
    auVar247 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                ((long)pGVar4[3].userPtr +
                                uVar52 * *(long *)&pGVar4[3].fnumTimeSegments),auVar127,auVar66);
    auVar96 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                ((long)pGVar4[3].userPtr +
                                *(long *)&pGVar4[3].fnumTimeSegments * lVar54),auVar10,auVar66);
    auVar124 = ZEXT816(0) << 0x40;
    auVar67._0_4_ = auVar9._0_4_ * 0.0;
    auVar67._4_4_ = auVar9._4_4_ * 0.0;
    auVar67._8_4_ = auVar9._8_4_ * 0.0;
    auVar67._12_4_ = auVar9._12_4_ * 0.0;
    auVar64 = vfmadd231ps_fma(auVar67,auVar237,auVar124);
    auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar64);
    local_528._0_4_ = auVar12._0_4_ + auVar65._0_4_;
    local_528._4_4_ = auVar12._4_4_ + auVar65._4_4_;
    fStack_520 = auVar12._8_4_ + auVar65._8_4_;
    fStack_51c = auVar12._12_4_ + auVar65._12_4_;
    auVar255._8_4_ = 0x40400000;
    auVar255._0_8_ = 0x4040000040400000;
    auVar255._12_4_ = 0x40400000;
    auVar65 = vfmadd231ps_fma(auVar64,auVar11,auVar255);
    auVar63 = vfnmadd231ps_fma(auVar65,auVar12,auVar255);
    auVar207._0_4_ = auVar10._0_4_ * 0.0;
    auVar207._4_4_ = auVar10._4_4_ * 0.0;
    auVar207._8_4_ = auVar10._8_4_ * 0.0;
    auVar207._12_4_ = auVar10._12_4_ * 0.0;
    auVar64 = vfmadd231ps_fma(auVar207,auVar96,auVar124);
    auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar247,auVar64);
    auVar246._0_4_ = auVar127._0_4_ + auVar65._0_4_;
    auVar246._4_4_ = auVar127._4_4_ + auVar65._4_4_;
    auVar246._8_4_ = auVar127._8_4_ + auVar65._8_4_;
    auVar246._12_4_ = auVar127._12_4_ + auVar65._12_4_;
    auVar65 = vfmadd231ps_fma(auVar64,auVar247,auVar255);
    auVar64 = vfnmadd231ps_fma(auVar65,auVar127,auVar255);
    auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar237,auVar9);
    auVar65 = vfmadd231ps_fma(auVar65,auVar11,auVar124);
    auVar65 = vfmadd231ps_fma(auVar65,auVar12,auVar124);
    auVar122._0_4_ = auVar9._0_4_ * 3.0;
    auVar122._4_4_ = auVar9._4_4_ * 3.0;
    auVar122._8_4_ = auVar9._8_4_ * 3.0;
    auVar122._12_4_ = auVar9._12_4_ * 3.0;
    auVar9 = vfnmadd231ps_fma(auVar122,auVar255,auVar237);
    auVar9 = vfmadd231ps_fma(auVar9,auVar124,auVar11);
    auVar237 = vfnmadd231ps_fma(auVar9,auVar124,auVar12);
    auVar12 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar96,auVar10);
    auVar12 = vfmadd231ps_fma(auVar12,auVar247,auVar124);
    auVar11 = vfmadd231ps_fma(auVar12,auVar127,auVar124);
    auVar164._0_4_ = auVar10._0_4_ * 3.0;
    auVar164._4_4_ = auVar10._4_4_ * 3.0;
    auVar164._8_4_ = auVar10._8_4_ * 3.0;
    auVar164._12_4_ = auVar10._12_4_ * 3.0;
    auVar12 = vfnmadd231ps_fma(auVar164,auVar255,auVar96);
    auVar12 = vfmadd231ps_fma(auVar12,auVar124,auVar247);
    auVar247 = vfnmadd231ps_fma(auVar12,auVar124,auVar127);
    auVar12 = vshufps_avx(auVar63,auVar63,0xc9);
    auVar9 = vshufps_avx(auVar246,auVar246,0xc9);
    fVar178 = auVar63._0_4_;
    auVar180._0_4_ = fVar178 * auVar9._0_4_;
    fVar192 = auVar63._4_4_;
    auVar180._4_4_ = fVar192 * auVar9._4_4_;
    fVar193 = auVar63._8_4_;
    auVar180._8_4_ = fVar193 * auVar9._8_4_;
    fVar194 = auVar63._12_4_;
    auVar180._12_4_ = fVar194 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar180,auVar12,auVar246);
    auVar127 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar64,auVar64,0xc9);
    auVar197._0_4_ = auVar9._0_4_ * fVar178;
    auVar197._4_4_ = auVar9._4_4_ * fVar192;
    auVar197._8_4_ = auVar9._8_4_ * fVar193;
    auVar197._12_4_ = auVar9._12_4_ * fVar194;
    auVar12 = vfmsub231ps_fma(auVar197,auVar12,auVar64);
    auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar12 = vshufps_avx(auVar237,auVar237,0xc9);
    auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
    fVar59 = auVar237._0_4_;
    auVar208._0_4_ = auVar9._0_4_ * fVar59;
    fVar91 = auVar237._4_4_;
    auVar208._4_4_ = auVar9._4_4_ * fVar91;
    fVar120 = auVar237._8_4_;
    auVar208._8_4_ = auVar9._8_4_ * fVar120;
    fVar92 = auVar237._12_4_;
    auVar208._12_4_ = auVar9._12_4_ * fVar92;
    auVar9 = vfmsub231ps_fma(auVar208,auVar12,auVar11);
    auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar247,auVar247,0xc9);
    auVar209._0_4_ = auVar9._0_4_ * fVar59;
    auVar209._4_4_ = auVar9._4_4_ * fVar91;
    auVar209._8_4_ = auVar9._8_4_ * fVar120;
    auVar209._12_4_ = auVar9._12_4_ * fVar92;
    auVar12 = vfmsub231ps_fma(auVar209,auVar12,auVar247);
    auVar247 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar12 = vdpps_avx(auVar127,auVar127,0x7f);
    fVar61 = auVar12._0_4_;
    auVar222._4_12_ = ZEXT812(0) << 0x20;
    auVar222._0_4_ = fVar61;
    auVar9 = vrsqrtss_avx(auVar222,auVar222);
    fVar93 = auVar9._0_4_;
    fVar144 = fVar93 * 1.5 - fVar61 * 0.5 * fVar93 * fVar93 * fVar93;
    auVar9 = vdpps_avx(auVar127,auVar10,0x7f);
    fVar143 = fVar144 * auVar127._0_4_;
    fVar161 = fVar144 * auVar127._4_4_;
    fVar162 = fVar144 * auVar127._8_4_;
    fVar163 = fVar144 * auVar127._12_4_;
    auVar198._0_4_ = fVar61 * auVar10._0_4_;
    auVar198._4_4_ = fVar61 * auVar10._4_4_;
    auVar198._8_4_ = fVar61 * auVar10._8_4_;
    auVar198._12_4_ = fVar61 * auVar10._12_4_;
    fVar93 = auVar9._0_4_;
    auVar181._0_4_ = fVar93 * auVar127._0_4_;
    auVar181._4_4_ = fVar93 * auVar127._4_4_;
    auVar181._8_4_ = fVar93 * auVar127._8_4_;
    auVar181._12_4_ = fVar93 * auVar127._12_4_;
    auVar127 = vsubps_avx(auVar198,auVar181);
    auVar9 = vrcpss_avx(auVar222,auVar222);
    auVar12 = vfnmadd213ss_fma(auVar12,auVar9,SUB6416(ZEXT464(0x40000000),0));
    fVar93 = auVar9._0_4_ * auVar12._0_4_;
    auVar12 = vdpps_avx(auVar11,auVar11,0x7f);
    fVar61 = auVar12._0_4_;
    auVar210._4_12_ = ZEXT812(0) << 0x20;
    auVar210._0_4_ = fVar61;
    auVar9 = vrsqrtss_avx(auVar210,auVar210);
    fVar220 = auVar9._0_4_;
    auVar9 = vdpps_avx(auVar11,auVar247,0x7f);
    fVar220 = fVar220 * 1.5 - fVar61 * 0.5 * fVar220 * fVar220 * fVar220;
    fVar233 = fVar220 * auVar11._0_4_;
    fVar243 = fVar220 * auVar11._4_4_;
    fVar244 = fVar220 * auVar11._8_4_;
    fVar245 = fVar220 * auVar11._12_4_;
    auVar165._0_4_ = fVar61 * auVar247._0_4_;
    auVar165._4_4_ = fVar61 * auVar247._4_4_;
    auVar165._8_4_ = fVar61 * auVar247._8_4_;
    auVar165._12_4_ = fVar61 * auVar247._12_4_;
    fVar61 = auVar9._0_4_;
    auVar135._0_4_ = fVar61 * auVar11._0_4_;
    auVar135._4_4_ = fVar61 * auVar11._4_4_;
    auVar135._8_4_ = fVar61 * auVar11._8_4_;
    auVar135._12_4_ = fVar61 * auVar11._12_4_;
    auVar10 = vsubps_avx(auVar165,auVar135);
    auVar9 = vrcpss_avx(auVar210,auVar210);
    auVar12 = vfnmadd213ss_fma(auVar12,auVar9,ZEXT416(0x40000000));
    fVar61 = auVar12._0_4_ * auVar9._0_4_;
    auVar12 = vshufps_avx(_local_528,_local_528,0xff);
    auVar199._0_4_ = auVar12._0_4_ * fVar143;
    auVar199._4_4_ = auVar12._4_4_ * fVar161;
    auVar199._8_4_ = auVar12._8_4_ * fVar162;
    auVar199._12_4_ = auVar12._12_4_ * fVar163;
    local_408 = vsubps_avx(_local_528,auVar199);
    auVar9 = vshufps_avx(auVar63,auVar63,0xff);
    auVar148._0_4_ = auVar9._0_4_ * fVar143 + auVar12._0_4_ * fVar144 * fVar93 * auVar127._0_4_;
    auVar148._4_4_ = auVar9._4_4_ * fVar161 + auVar12._4_4_ * fVar144 * fVar93 * auVar127._4_4_;
    auVar148._8_4_ = auVar9._8_4_ * fVar162 + auVar12._8_4_ * fVar144 * fVar93 * auVar127._8_4_;
    auVar148._12_4_ = auVar9._12_4_ * fVar163 + auVar12._12_4_ * fVar144 * fVar93 * auVar127._12_4_;
    auVar127 = vsubps_avx(auVar63,auVar148);
    local_418._0_4_ = auVar199._0_4_ + (float)local_528._0_4_;
    local_418._4_4_ = auVar199._4_4_ + (float)local_528._4_4_;
    fStack_410 = auVar199._8_4_ + fStack_520;
    fStack_40c = auVar199._12_4_ + fStack_51c;
    auVar12 = vshufps_avx(auVar65,auVar65,0xff);
    auVar97._0_4_ = fVar233 * auVar12._0_4_;
    auVar97._4_4_ = fVar243 * auVar12._4_4_;
    auVar97._8_4_ = fVar244 * auVar12._8_4_;
    auVar97._12_4_ = fVar245 * auVar12._12_4_;
    local_428 = vsubps_avx(auVar65,auVar97);
    auVar9 = vshufps_avx(auVar237,auVar237,0xff);
    auVar68._0_4_ = fVar233 * auVar9._0_4_ + auVar12._0_4_ * fVar220 * auVar10._0_4_ * fVar61;
    auVar68._4_4_ = fVar243 * auVar9._4_4_ + auVar12._4_4_ * fVar220 * auVar10._4_4_ * fVar61;
    auVar68._8_4_ = fVar244 * auVar9._8_4_ + auVar12._8_4_ * fVar220 * auVar10._8_4_ * fVar61;
    auVar68._12_4_ = fVar245 * auVar9._12_4_ + auVar12._12_4_ * fVar220 * auVar10._12_4_ * fVar61;
    auVar12 = vsubps_avx(auVar237,auVar68);
    local_498 = auVar65._0_4_ + auVar97._0_4_;
    fStack_494 = auVar65._4_4_ + auVar97._4_4_;
    fStack_490 = auVar65._8_4_ + auVar97._8_4_;
    fStack_48c = auVar65._12_4_ + auVar97._12_4_;
    local_438._0_4_ = local_408._0_4_ + auVar127._0_4_ * 0.33333334;
    local_438._4_4_ = local_408._4_4_ + auVar127._4_4_ * 0.33333334;
    local_438._8_4_ = local_408._8_4_ + auVar127._8_4_ * 0.33333334;
    local_438._12_4_ = local_408._12_4_ + auVar127._12_4_ * 0.33333334;
    auVar69._0_4_ = auVar12._0_4_ * 0.33333334;
    auVar69._4_4_ = auVar12._4_4_ * 0.33333334;
    auVar69._8_4_ = auVar12._8_4_ * 0.33333334;
    auVar69._12_4_ = auVar12._12_4_ * 0.33333334;
    local_448 = vsubps_avx(local_428,auVar69);
    aVar1 = (ray->super_RayK<1>).org.field_0;
    auVar127 = vsubps_avx(local_408,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar127,auVar127,0x55);
    auVar9 = vshufps_avx(auVar127,auVar127,0xaa);
    aVar2 = (pre->ray_space).vy.field_0;
    fVar93 = (pre->ray_space).vz.field_0.m128[0];
    fVar61 = (pre->ray_space).vz.field_0.m128[1];
    fVar144 = (pre->ray_space).vz.field_0.m128[2];
    fVar220 = (pre->ray_space).vz.field_0.m128[3];
    auVar70._0_4_ = fVar93 * auVar9._0_4_;
    auVar70._4_4_ = fVar61 * auVar9._4_4_;
    auVar70._8_4_ = fVar144 * auVar9._8_4_;
    auVar70._12_4_ = fVar220 * auVar9._12_4_;
    auVar96 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar12);
    auVar10 = vsubps_avx(local_438,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar10,auVar10,0x55);
    auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar71._0_4_ = fVar93 * auVar9._0_4_;
    auVar71._4_4_ = fVar61 * auVar9._4_4_;
    auVar71._8_4_ = fVar144 * auVar9._8_4_;
    auVar71._12_4_ = fVar220 * auVar9._12_4_;
    auVar63 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar12);
    auVar9 = vsubps_avx(local_448,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar72._0_4_ = fVar93 * auVar12._0_4_;
    auVar72._4_4_ = fVar61 * auVar12._4_4_;
    auVar72._8_4_ = fVar144 * auVar12._8_4_;
    auVar72._12_4_ = fVar220 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar9,auVar9,0x55);
    auVar124 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar12);
    auVar11 = vsubps_avx(local_428,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar73._0_4_ = fVar93 * auVar12._0_4_;
    auVar73._4_4_ = fVar61 * auVar12._4_4_;
    auVar73._8_4_ = fVar144 * auVar12._8_4_;
    auVar73._12_4_ = fVar220 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar11,auVar11,0x55);
    auVar121 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar12);
    auVar247 = vsubps_avx(_local_418,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar247,auVar247,0xaa);
    auVar149._0_4_ = fVar93 * auVar12._0_4_;
    auVar149._4_4_ = fVar61 * auVar12._4_4_;
    auVar149._8_4_ = fVar144 * auVar12._8_4_;
    auVar149._12_4_ = fVar220 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar247,auVar247,0x55);
    auVar134 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar2,auVar12);
    local_458._0_4_ = (fVar178 + auVar148._0_4_) * 0.33333334 + (float)local_418._0_4_;
    local_458._4_4_ = (fVar192 + auVar148._4_4_) * 0.33333334 + (float)local_418._4_4_;
    fStack_450 = (fVar193 + auVar148._8_4_) * 0.33333334 + fStack_410;
    fStack_44c = (fVar194 + auVar148._12_4_) * 0.33333334 + fStack_40c;
    auVar65 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
    auVar223._0_4_ = fVar93 * auVar12._0_4_;
    auVar223._4_4_ = fVar61 * auVar12._4_4_;
    auVar223._8_4_ = fVar144 * auVar12._8_4_;
    auVar223._12_4_ = fVar220 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar65,auVar65,0x55);
    auVar62 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar2,auVar12);
    auVar235._0_4_ = (fVar59 + auVar68._0_4_) * 0.33333334;
    auVar235._4_4_ = (fVar91 + auVar68._4_4_) * 0.33333334;
    auVar235._8_4_ = (fVar120 + auVar68._8_4_) * 0.33333334;
    auVar235._12_4_ = (fVar92 + auVar68._12_4_) * 0.33333334;
    auVar42._4_4_ = fStack_494;
    auVar42._0_4_ = local_498;
    auVar42._8_4_ = fStack_490;
    auVar42._12_4_ = fStack_48c;
    _local_468 = vsubps_avx(auVar42,auVar235);
    auVar64 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar236._0_4_ = fVar93 * auVar12._0_4_;
    auVar236._4_4_ = fVar61 * auVar12._4_4_;
    auVar236._8_4_ = fVar144 * auVar12._8_4_;
    auVar236._12_4_ = fVar220 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar64,auVar64,0x55);
    auVar95 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar2,auVar12);
    auVar237 = vsubps_avx(auVar42,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar237,auVar237,0xaa);
    auVar182._0_4_ = fVar93 * auVar12._0_4_;
    auVar182._4_4_ = fVar61 * auVar12._4_4_;
    auVar182._8_4_ = fVar144 * auVar12._8_4_;
    auVar182._12_4_ = fVar220 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar237,auVar237,0x55);
    auVar12 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar12);
    local_528._0_4_ = auVar127._0_4_;
    auVar166._4_4_ = local_528._0_4_;
    auVar166._0_4_ = local_528._0_4_;
    auVar166._8_4_ = local_528._0_4_;
    auVar166._12_4_ = local_528._0_4_;
    aVar2 = (pre->ray_space).vx.field_0;
    auVar96 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar2,auVar166);
    local_388._0_4_ = auVar10._0_4_;
    auVar167._4_4_ = local_388._0_4_;
    auVar167._0_4_ = local_388._0_4_;
    auVar167._8_4_ = local_388._0_4_;
    auVar167._12_4_ = local_388._0_4_;
    auVar10 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar167);
    uVar60 = auVar9._0_4_;
    auVar168._4_4_ = uVar60;
    auVar168._0_4_ = uVar60;
    auVar168._8_4_ = uVar60;
    auVar168._12_4_ = uVar60;
    auVar63 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar2,auVar168);
    uVar60 = auVar11._0_4_;
    auVar169._4_4_ = uVar60;
    auVar169._0_4_ = uVar60;
    auVar169._8_4_ = uVar60;
    auVar169._12_4_ = uVar60;
    auVar11 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar2,auVar169);
    uVar60 = auVar247._0_4_;
    auVar170._4_4_ = uVar60;
    auVar170._0_4_ = uVar60;
    auVar170._8_4_ = uVar60;
    auVar170._12_4_ = uVar60;
    auVar247 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar2,auVar170);
    uVar60 = auVar65._0_4_;
    auVar171._4_4_ = uVar60;
    auVar171._0_4_ = uVar60;
    auVar171._8_4_ = uVar60;
    auVar171._12_4_ = uVar60;
    auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar171);
    uVar60 = auVar64._0_4_;
    auVar74._4_4_ = uVar60;
    auVar74._0_4_ = uVar60;
    auVar74._8_4_ = uVar60;
    auVar74._12_4_ = uVar60;
    auVar64 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar74);
    uVar60 = auVar237._0_4_;
    auVar75._4_4_ = uVar60;
    auVar75._0_4_ = uVar60;
    auVar75._8_4_ = uVar60;
    auVar75._12_4_ = uVar60;
    auVar237 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar75);
    local_488 = vmovlhps_avx(auVar96,auVar247);
    _local_528 = vmovlhps_avx(auVar10,auVar65);
    local_478 = vmovlhps_avx(auVar63,auVar64);
    _local_378 = vmovlhps_avx(auVar11,auVar237);
    auVar12 = vminps_avx(local_488,_local_528);
    auVar9 = vminps_avx(local_478,_local_378);
    auVar127 = vminps_avx(auVar12,auVar9);
    auVar12 = vmaxps_avx(local_488,_local_528);
    auVar9 = vmaxps_avx(local_478,_local_378);
    auVar12 = vmaxps_avx(auVar12,auVar9);
    auVar9 = vshufpd_avx(auVar127,auVar127,3);
    auVar127 = vminps_avx(auVar127,auVar9);
    auVar9 = vshufpd_avx(auVar12,auVar12,3);
    auVar9 = vmaxps_avx(auVar12,auVar9);
    auVar12 = vandps_avx(local_2f8,auVar127);
    auVar9 = vandps_avx(local_2f8,auVar9);
    auVar12 = vmaxps_avx(auVar12,auVar9);
    auVar9 = vmovshdup_avx(auVar12);
    auVar12 = vmaxss_avx(auVar9,auVar12);
    local_4b0 = (ulong)uVar49 + 0xf;
    local_1b8 = auVar12._0_4_ * 9.536743e-07;
    local_4c8._8_8_ = auVar96._0_8_;
    local_4c8._0_8_ = auVar96._0_8_;
    auVar205 = ZEXT1664(local_4c8);
    local_3b8._8_8_ = auVar10._0_8_;
    local_3b8._0_8_ = auVar10._0_8_;
    local_3c8._8_8_ = auVar63._0_8_;
    local_3c8._0_8_ = auVar63._0_8_;
    local_3d8._8_8_ = auVar11._0_8_;
    local_3d8._0_8_ = auVar11._0_8_;
    register0x00001308 = auVar247._0_8_;
    local_3e8 = auVar247._0_8_;
    auVar142 = ZEXT1664(_local_3e8);
    local_4d8._8_8_ = auVar65._0_8_;
    local_4d8._0_8_ = auVar65._0_8_;
    auVar177 = ZEXT1664(local_4d8);
    local_4e8._8_8_ = auVar64._0_8_;
    local_4e8._0_8_ = auVar64._0_8_;
    auVar232 = ZEXT1664(local_4e8);
    local_4f8._8_8_ = auVar237._0_8_;
    local_4f8._0_8_ = auVar237._0_8_;
    auVar242 = ZEXT1664(local_4f8);
    local_388 = ZEXT416((uint)local_1b8);
    fStack_1b4 = local_1b8;
    fStack_1b0 = local_1b8;
    fStack_1ac = local_1b8;
    fStack_1a8 = local_1b8;
    fStack_1a4 = local_1b8;
    fStack_1a0 = local_1b8;
    fStack_19c = local_1b8;
    local_1d8 = (uint)local_1b8 ^ local_3f8;
    uStack_1d4 = local_1d8;
    uStack_1d0 = local_1d8;
    uStack_1cc = local_1d8;
    uStack_1c8 = local_1d8;
    uStack_1c4 = local_1d8;
    uStack_1c0 = local_1d8;
    uStack_1bc = local_1d8;
    uVar52 = 0;
    local_208 = vsubps_avx(_local_528,local_488);
    local_218 = vsubps_avx(local_478,_local_528);
    local_228 = vsubps_avx(_local_378,local_478);
    auVar219 = ZEXT1664(local_3d8);
    auVar191 = ZEXT1664(local_3c8);
    auVar160 = ZEXT1664(local_3b8);
    local_248 = vsubps_avx(_local_418,local_408);
    local_258 = vsubps_avx(_local_458,local_438);
    local_268 = vsubps_avx(_local_468,local_448);
    auVar43._4_4_ = fStack_494;
    auVar43._0_4_ = local_498;
    auVar43._8_4_ = fStack_490;
    auVar43._12_4_ = fStack_48c;
    _local_278 = vsubps_avx(auVar43,local_428);
    auVar254 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar262 = ZEXT1664(ZEXT816(0x3f80000000000000));
    local_4a8 = prim;
LAB_015f6e0a:
    local_538 = auVar254._0_16_;
    local_238 = auVar262._0_16_;
    auVar12 = vshufps_avx(local_538,local_538,0x50);
    auVar270._8_4_ = 0x3f800000;
    auVar270._0_8_ = 0x3f8000003f800000;
    auVar270._12_4_ = 0x3f800000;
    auVar273._16_4_ = 0x3f800000;
    auVar273._0_16_ = auVar270;
    auVar273._20_4_ = 0x3f800000;
    auVar273._24_4_ = 0x3f800000;
    auVar273._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar270,auVar12);
    fVar59 = auVar12._0_4_;
    auVar76._0_4_ = auVar142._0_4_ * fVar59;
    fVar91 = auVar12._4_4_;
    auVar76._4_4_ = auVar142._4_4_ * fVar91;
    fVar120 = auVar12._8_4_;
    auVar76._8_4_ = auVar142._8_4_ * fVar120;
    fVar92 = auVar12._12_4_;
    auVar76._12_4_ = auVar142._12_4_ * fVar92;
    auVar172._0_4_ = auVar177._0_4_ * fVar59;
    auVar172._4_4_ = auVar177._4_4_ * fVar91;
    auVar172._8_4_ = auVar177._8_4_ * fVar120;
    auVar172._12_4_ = auVar177._12_4_ * fVar92;
    auVar136._0_4_ = auVar232._0_4_ * fVar59;
    auVar136._4_4_ = auVar232._4_4_ * fVar91;
    auVar136._8_4_ = auVar232._8_4_ * fVar120;
    auVar136._12_4_ = auVar232._12_4_ * fVar92;
    auVar111._0_4_ = auVar242._0_4_ * fVar59;
    auVar111._4_4_ = auVar242._4_4_ * fVar91;
    auVar111._8_4_ = auVar242._8_4_ * fVar120;
    auVar111._12_4_ = auVar242._12_4_ * fVar92;
    auVar11 = vfmadd231ps_fma(auVar76,auVar9,auVar205._0_16_);
    auVar247 = vfmadd231ps_fma(auVar172,auVar9,auVar160._0_16_);
    auVar65 = vfmadd231ps_fma(auVar136,auVar9,auVar191._0_16_);
    auVar64 = vfmadd231ps_fma(auVar111,auVar219._0_16_,auVar9);
    auVar12 = vmovshdup_avx(auVar262._0_16_);
    fVar59 = auVar262._0_4_;
    fStack_100 = (auVar12._0_4_ - fVar59) * 0.04761905;
    auVar218._4_4_ = fVar59;
    auVar218._0_4_ = fVar59;
    auVar218._8_4_ = fVar59;
    auVar218._12_4_ = fVar59;
    auVar218._16_4_ = fVar59;
    auVar218._20_4_ = fVar59;
    auVar218._24_4_ = fVar59;
    auVar218._28_4_ = fVar59;
    auVar108._0_8_ = auVar12._0_8_;
    auVar108._8_8_ = auVar108._0_8_;
    auVar108._16_8_ = auVar108._0_8_;
    auVar108._24_8_ = auVar108._0_8_;
    auVar88 = vsubps_avx(auVar108,auVar218);
    uVar60 = auVar11._0_4_;
    auVar268._4_4_ = uVar60;
    auVar268._0_4_ = uVar60;
    auVar268._8_4_ = uVar60;
    auVar268._12_4_ = uVar60;
    auVar268._16_4_ = uVar60;
    auVar268._20_4_ = uVar60;
    auVar268._24_4_ = uVar60;
    auVar268._28_4_ = uVar60;
    auVar12 = vmovshdup_avx(auVar11);
    uVar94 = auVar12._0_8_;
    auVar261._8_8_ = uVar94;
    auVar261._0_8_ = uVar94;
    auVar261._16_8_ = uVar94;
    auVar261._24_8_ = uVar94;
    fVar178 = auVar247._0_4_;
    auVar251._4_4_ = fVar178;
    auVar251._0_4_ = fVar178;
    auVar251._8_4_ = fVar178;
    auVar251._12_4_ = fVar178;
    auVar251._16_4_ = fVar178;
    auVar251._20_4_ = fVar178;
    auVar251._24_4_ = fVar178;
    auVar251._28_4_ = fVar178;
    auVar9 = vmovshdup_avx(auVar247);
    auVar109._0_8_ = auVar9._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    fVar220 = auVar65._0_4_;
    auVar188._4_4_ = fVar220;
    auVar188._0_4_ = fVar220;
    auVar188._8_4_ = fVar220;
    auVar188._12_4_ = fVar220;
    auVar188._16_4_ = fVar220;
    auVar188._20_4_ = fVar220;
    auVar188._24_4_ = fVar220;
    auVar188._28_4_ = fVar220;
    auVar127 = vmovshdup_avx(auVar65);
    auVar203._0_8_ = auVar127._0_8_;
    auVar203._8_8_ = auVar203._0_8_;
    auVar203._16_8_ = auVar203._0_8_;
    auVar203._24_8_ = auVar203._0_8_;
    fVar144 = auVar64._0_4_;
    auVar10 = vmovshdup_avx(auVar64);
    auVar237 = vfmadd132ps_fma(auVar88,auVar218,_DAT_01faff20);
    auVar88 = vsubps_avx(auVar273,ZEXT1632(auVar237));
    fVar59 = auVar237._0_4_;
    fVar91 = auVar237._4_4_;
    auVar13._4_4_ = fVar178 * fVar91;
    auVar13._0_4_ = fVar178 * fVar59;
    fVar120 = auVar237._8_4_;
    auVar13._8_4_ = fVar178 * fVar120;
    fVar92 = auVar237._12_4_;
    auVar13._12_4_ = fVar178 * fVar92;
    auVar13._16_4_ = fVar178 * 0.0;
    auVar13._20_4_ = fVar178 * 0.0;
    auVar13._24_4_ = fVar178 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar237 = vfmadd231ps_fma(auVar13,auVar88,auVar268);
    fVar93 = auVar9._0_4_;
    fVar61 = auVar9._4_4_;
    auVar14._4_4_ = fVar61 * fVar91;
    auVar14._0_4_ = fVar93 * fVar59;
    auVar14._8_4_ = fVar93 * fVar120;
    auVar14._12_4_ = fVar61 * fVar92;
    auVar14._16_4_ = fVar93 * 0.0;
    auVar14._20_4_ = fVar61 * 0.0;
    auVar14._24_4_ = fVar93 * 0.0;
    auVar14._28_4_ = uVar60;
    auVar96 = vfmadd231ps_fma(auVar14,auVar88,auVar261);
    auVar15._4_4_ = fVar220 * fVar91;
    auVar15._0_4_ = fVar220 * fVar59;
    auVar15._8_4_ = fVar220 * fVar120;
    auVar15._12_4_ = fVar220 * fVar92;
    auVar15._16_4_ = fVar220 * 0.0;
    auVar15._20_4_ = fVar220 * 0.0;
    auVar15._24_4_ = fVar220 * 0.0;
    auVar15._28_4_ = auVar12._4_4_;
    auVar63 = vfmadd231ps_fma(auVar15,auVar88,auVar251);
    fVar93 = auVar127._0_4_;
    fVar61 = auVar127._4_4_;
    auVar8._4_4_ = fVar61 * fVar91;
    auVar8._0_4_ = fVar93 * fVar59;
    auVar8._8_4_ = fVar93 * fVar120;
    auVar8._12_4_ = fVar61 * fVar92;
    auVar8._16_4_ = fVar93 * 0.0;
    auVar8._20_4_ = fVar61 * 0.0;
    auVar8._24_4_ = fVar93 * 0.0;
    auVar8._28_4_ = fVar178;
    auVar124 = vfmadd231ps_fma(auVar8,auVar88,auVar109);
    auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
    local_3a8._8_8_ = auVar12._0_8_;
    local_3a8._0_8_ = local_3a8._8_8_;
    local_3a8._16_8_ = local_3a8._8_8_;
    local_3a8._24_8_ = local_3a8._8_8_;
    auVar9 = vshufps_avx(auVar11,auVar11,0xff);
    uStack_510 = auVar9._0_8_;
    local_518 = (undefined1  [8])uStack_510;
    uStack_508 = uStack_510;
    uStack_500 = uStack_510;
    auVar16._4_4_ = fVar144 * fVar91;
    auVar16._0_4_ = fVar144 * fVar59;
    auVar16._8_4_ = fVar144 * fVar120;
    auVar16._12_4_ = fVar144 * fVar92;
    auVar16._16_4_ = fVar144 * 0.0;
    auVar16._20_4_ = fVar144 * 0.0;
    auVar16._24_4_ = fVar144 * 0.0;
    auVar16._28_4_ = fVar144;
    auVar11 = vfmadd231ps_fma(auVar16,auVar88,auVar188);
    auVar9 = vshufps_avx(auVar247,auVar247,0xaa);
    auVar189._0_8_ = auVar9._0_8_;
    auVar189._8_8_ = auVar189._0_8_;
    auVar189._16_8_ = auVar189._0_8_;
    auVar189._24_8_ = auVar189._0_8_;
    auVar127 = vshufps_avx(auVar247,auVar247,0xff);
    local_318._8_8_ = auVar127._0_8_;
    local_318._0_8_ = local_318._8_8_;
    local_318._16_8_ = local_318._8_8_;
    local_318._24_8_ = local_318._8_8_;
    fVar93 = auVar10._0_4_;
    fVar61 = auVar10._4_4_;
    auVar18._4_4_ = fVar61 * fVar91;
    auVar18._0_4_ = fVar93 * fVar59;
    auVar18._8_4_ = fVar93 * fVar120;
    auVar18._12_4_ = fVar61 * fVar92;
    auVar18._16_4_ = fVar93 * 0.0;
    auVar18._20_4_ = fVar61 * 0.0;
    auVar18._24_4_ = fVar93 * 0.0;
    auVar18._28_4_ = auVar12._4_4_;
    auVar121 = vfmadd231ps_fma(auVar18,auVar88,auVar203);
    auVar253._28_4_ = fVar61;
    auVar253._0_28_ =
         ZEXT1628(CONCAT412(auVar63._12_4_ * fVar92,
                            CONCAT48(auVar63._8_4_ * fVar120,
                                     CONCAT44(auVar63._4_4_ * fVar91,auVar63._0_4_ * fVar59))));
    auVar237 = vfmadd231ps_fma(auVar253,auVar88,ZEXT1632(auVar237));
    fVar93 = auVar127._4_4_;
    auVar19._28_4_ = fVar93;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar124._12_4_ * fVar92,
                            CONCAT48(auVar124._8_4_ * fVar120,
                                     CONCAT44(auVar124._4_4_ * fVar91,auVar124._0_4_ * fVar59))));
    auVar96 = vfmadd231ps_fma(auVar19,auVar88,ZEXT1632(auVar96));
    auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
    uVar94 = auVar12._0_8_;
    auVar176._8_8_ = uVar94;
    auVar176._0_8_ = uVar94;
    auVar176._16_8_ = uVar94;
    auVar176._24_8_ = uVar94;
    auVar10 = vshufps_avx(auVar65,auVar65,0xff);
    uVar94 = auVar10._0_8_;
    auVar274._8_8_ = uVar94;
    auVar274._0_8_ = uVar94;
    auVar274._16_8_ = uVar94;
    auVar274._24_8_ = uVar94;
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                                 CONCAT48(auVar11._8_4_ * fVar120,
                                                          CONCAT44(auVar11._4_4_ * fVar91,
                                                                   auVar11._0_4_ * fVar59)))),
                              auVar88,ZEXT1632(auVar63));
    auVar11 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar247 = vshufps_avx(auVar64,auVar64,0xff);
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar121._12_4_,
                                                 CONCAT48(fVar120 * auVar121._8_4_,
                                                          CONCAT44(fVar91 * auVar121._4_4_,
                                                                   fVar59 * auVar121._0_4_)))),
                              auVar88,ZEXT1632(auVar124));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar65._12_4_,
                                                 CONCAT48(fVar120 * auVar65._8_4_,
                                                          CONCAT44(fVar91 * auVar65._4_4_,
                                                                   fVar59 * auVar65._0_4_)))),
                              auVar88,ZEXT1632(auVar237));
    auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar237));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar64._12_4_,
                                                 CONCAT48(fVar120 * auVar64._8_4_,
                                                          CONCAT44(fVar91 * auVar64._4_4_,
                                                                   fVar59 * auVar64._0_4_)))),
                              auVar88,ZEXT1632(auVar96));
    auVar14 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar96));
    fStack_2cc = auVar14._28_4_;
    auVar252._0_4_ = fStack_100 * auVar13._0_4_ * 3.0;
    auVar252._4_4_ = fStack_100 * auVar13._4_4_ * 3.0;
    auVar252._8_4_ = fStack_100 * auVar13._8_4_ * 3.0;
    auVar252._12_4_ = fStack_100 * auVar13._12_4_ * 3.0;
    auVar252._16_4_ = fStack_100 * auVar13._16_4_ * 3.0;
    auVar252._20_4_ = fStack_100 * auVar13._20_4_ * 3.0;
    auVar252._24_4_ = fStack_100 * auVar13._24_4_ * 3.0;
    auVar252._28_4_ = 0;
    local_2e8._0_4_ = fStack_100 * auVar14._0_4_ * 3.0;
    local_2e8._4_4_ = fStack_100 * auVar14._4_4_ * 3.0;
    fStack_2e0 = fStack_100 * auVar14._8_4_ * 3.0;
    fStack_2dc = fStack_100 * auVar14._12_4_ * 3.0;
    fStack_2d8 = fStack_100 * auVar14._16_4_ * 3.0;
    fStack_2d4 = fStack_100 * auVar14._20_4_ * 3.0;
    fStack_2d0 = fStack_100 * auVar14._24_4_ * 3.0;
    fVar61 = auVar9._0_4_;
    fVar144 = auVar9._4_4_;
    auVar20._4_4_ = fVar144 * fVar91;
    auVar20._0_4_ = fVar61 * fVar59;
    auVar20._8_4_ = fVar61 * fVar120;
    auVar20._12_4_ = fVar144 * fVar92;
    auVar20._16_4_ = fVar61 * 0.0;
    auVar20._20_4_ = fVar144 * 0.0;
    auVar20._24_4_ = fVar61 * 0.0;
    auVar20._28_4_ = fStack_2cc;
    auVar9 = vfmadd231ps_fma(auVar20,auVar88,local_3a8);
    fVar61 = auVar127._0_4_;
    auVar21._4_4_ = fVar93 * fVar91;
    auVar21._0_4_ = fVar61 * fVar59;
    auVar21._8_4_ = fVar61 * fVar120;
    auVar21._12_4_ = fVar93 * fVar92;
    auVar21._16_4_ = fVar61 * 0.0;
    auVar21._20_4_ = fVar93 * 0.0;
    auVar21._24_4_ = fVar61 * 0.0;
    auVar21._28_4_ = 0;
    auVar127 = vfmadd231ps_fma(auVar21,auVar88,_local_518);
    fVar93 = auVar12._0_4_;
    fVar61 = auVar12._4_4_;
    auVar22._4_4_ = fVar61 * fVar91;
    auVar22._0_4_ = fVar93 * fVar59;
    auVar22._8_4_ = fVar93 * fVar120;
    auVar22._12_4_ = fVar61 * fVar92;
    auVar22._16_4_ = fVar93 * 0.0;
    auVar22._20_4_ = fVar61 * 0.0;
    auVar22._24_4_ = fVar93 * 0.0;
    auVar22._28_4_ = auVar13._28_4_;
    auVar12 = vfmadd231ps_fma(auVar22,auVar88,auVar189);
    fVar93 = auVar10._0_4_;
    fVar220 = auVar10._4_4_;
    auVar23._4_4_ = fVar220 * fVar91;
    auVar23._0_4_ = fVar93 * fVar59;
    auVar23._8_4_ = fVar93 * fVar120;
    auVar23._12_4_ = fVar220 * fVar92;
    auVar23._16_4_ = fVar93 * 0.0;
    auVar23._20_4_ = fVar220 * 0.0;
    auVar23._24_4_ = fVar93 * 0.0;
    auVar23._28_4_ = fVar144;
    auVar10 = vfmadd231ps_fma(auVar23,auVar88,local_318);
    local_318 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar63));
    fVar93 = auVar11._0_4_;
    fVar61 = auVar11._4_4_;
    auVar24._4_4_ = fVar61 * fVar91;
    auVar24._0_4_ = fVar93 * fVar59;
    auVar24._8_4_ = fVar93 * fVar120;
    auVar24._12_4_ = fVar61 * fVar92;
    auVar24._16_4_ = fVar93 * 0.0;
    auVar24._20_4_ = fVar61 * 0.0;
    auVar24._24_4_ = fVar93 * 0.0;
    auVar24._28_4_ = fVar61;
    auVar11 = vfmadd231ps_fma(auVar24,auVar88,auVar176);
    _local_518 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar65));
    auVar18 = _local_518;
    fVar93 = auVar247._0_4_;
    fVar61 = auVar247._4_4_;
    auVar25._4_4_ = fVar61 * fVar91;
    auVar25._0_4_ = fVar93 * fVar59;
    auVar25._8_4_ = fVar93 * fVar120;
    auVar25._12_4_ = fVar61 * fVar92;
    auVar25._16_4_ = fVar93 * 0.0;
    auVar25._20_4_ = fVar61 * 0.0;
    auVar25._24_4_ = fVar93 * 0.0;
    auVar25._28_4_ = fVar61;
    auVar247 = vfmadd231ps_fma(auVar25,auVar88,auVar274);
    auVar26._28_4_ = fVar220;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar12._12_4_ * fVar92,
                            CONCAT48(auVar12._8_4_ * fVar120,
                                     CONCAT44(auVar12._4_4_ * fVar91,auVar12._0_4_ * fVar59))));
    auVar9 = vfmadd231ps_fma(auVar26,auVar88,ZEXT1632(auVar9));
    auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar10._12_4_,
                                                  CONCAT48(fVar120 * auVar10._8_4_,
                                                           CONCAT44(fVar91 * auVar10._4_4_,
                                                                    fVar59 * auVar10._0_4_)))),
                               auVar88,ZEXT1632(auVar127));
    local_3a8._0_4_ = auVar63._0_4_ + auVar252._0_4_;
    local_3a8._4_4_ = auVar63._4_4_ + auVar252._4_4_;
    local_3a8._8_4_ = auVar63._8_4_ + auVar252._8_4_;
    local_3a8._12_4_ = auVar63._12_4_ + auVar252._12_4_;
    local_3a8._16_4_ = auVar252._16_4_ + 0.0;
    local_3a8._20_4_ = auVar252._20_4_ + 0.0;
    local_3a8._24_4_ = auVar252._24_4_ + 0.0;
    local_3a8._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                                 CONCAT48(auVar11._8_4_ * fVar120,
                                                          CONCAT44(auVar11._4_4_ * fVar91,
                                                                   auVar11._0_4_ * fVar59)))),
                              auVar88,ZEXT1632(auVar12));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar247._12_4_ * fVar92,
                                                 CONCAT48(auVar247._8_4_ * fVar120,
                                                          CONCAT44(auVar247._4_4_ * fVar91,
                                                                   auVar247._0_4_ * fVar59)))),
                              auVar88,ZEXT1632(auVar10));
    auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar12._12_4_,
                                                 CONCAT48(fVar120 * auVar12._8_4_,
                                                          CONCAT44(fVar91 * auVar12._4_4_,
                                                                   fVar59 * auVar12._0_4_)))),
                              auVar88,ZEXT1632(auVar9));
    auVar247 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar92,
                                                  CONCAT48(auVar10._8_4_ * fVar120,
                                                           CONCAT44(auVar10._4_4_ * fVar91,
                                                                    auVar10._0_4_ * fVar59)))),
                               ZEXT1632(auVar127),auVar88);
    auVar88 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
    auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar127));
    auVar269._0_4_ = fStack_100 * auVar88._0_4_ * 3.0;
    auVar269._4_4_ = fStack_100 * auVar88._4_4_ * 3.0;
    auVar269._8_4_ = fStack_100 * auVar88._8_4_ * 3.0;
    auVar269._12_4_ = fStack_100 * auVar88._12_4_ * 3.0;
    auVar269._16_4_ = fStack_100 * auVar88._16_4_ * 3.0;
    auVar269._20_4_ = fStack_100 * auVar88._20_4_ * 3.0;
    auVar269._24_4_ = fStack_100 * auVar88._24_4_ * 3.0;
    auVar269._28_4_ = 0;
    local_118 = fStack_100 * auVar13._0_4_ * 3.0;
    fStack_114 = fStack_100 * auVar13._4_4_ * 3.0;
    auVar27._4_4_ = fStack_114;
    auVar27._0_4_ = local_118;
    fStack_110 = fStack_100 * auVar13._8_4_ * 3.0;
    auVar27._8_4_ = fStack_110;
    fStack_10c = fStack_100 * auVar13._12_4_ * 3.0;
    auVar27._12_4_ = fStack_10c;
    fStack_108 = fStack_100 * auVar13._16_4_ * 3.0;
    auVar27._16_4_ = fStack_108;
    fStack_104 = fStack_100 * auVar13._20_4_ * 3.0;
    auVar27._20_4_ = fStack_104;
    fStack_100 = fStack_100 * auVar13._24_4_ * 3.0;
    auVar27._24_4_ = fStack_100;
    auVar27._28_4_ = 0x40400000;
    _local_338 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar11));
    local_1f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar247));
    auVar88 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar63));
    auVar13 = vsubps_avx(ZEXT1632(auVar247),ZEXT1632(auVar65));
    auVar14 = vsubps_avx(_local_338,local_318);
    fVar178 = auVar88._0_4_ + auVar14._0_4_;
    fVar192 = auVar88._4_4_ + auVar14._4_4_;
    fVar193 = auVar88._8_4_ + auVar14._8_4_;
    fVar194 = auVar88._12_4_ + auVar14._12_4_;
    fVar143 = auVar88._16_4_ + auVar14._16_4_;
    fVar161 = auVar88._20_4_ + auVar14._20_4_;
    fVar162 = auVar88._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_1f8,_local_518);
    auVar89._0_4_ = auVar13._0_4_ + auVar15._0_4_;
    auVar89._4_4_ = auVar13._4_4_ + auVar15._4_4_;
    auVar89._8_4_ = auVar13._8_4_ + auVar15._8_4_;
    auVar89._12_4_ = auVar13._12_4_ + auVar15._12_4_;
    auVar89._16_4_ = auVar13._16_4_ + auVar15._16_4_;
    auVar89._20_4_ = auVar13._20_4_ + auVar15._20_4_;
    auVar89._24_4_ = auVar13._24_4_ + auVar15._24_4_;
    auVar89._28_4_ = auVar13._28_4_ + auVar15._28_4_;
    local_b8 = ZEXT1632(auVar65);
    fVar59 = auVar65._0_4_;
    local_138 = (float)local_2e8._0_4_ + fVar59;
    fVar91 = auVar65._4_4_;
    fStack_134 = (float)local_2e8._4_4_ + fVar91;
    fVar120 = auVar65._8_4_;
    fStack_130 = fStack_2e0 + fVar120;
    fVar92 = auVar65._12_4_;
    fStack_12c = fStack_2dc + fVar92;
    fStack_128 = fStack_2d8 + 0.0;
    fStack_124 = fStack_2d4 + 0.0;
    fStack_120 = fStack_2d0 + 0.0;
    local_78 = ZEXT1632(auVar63);
    auVar13 = vsubps_avx(local_78,auVar252);
    local_98 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar13 = vsubps_avx(local_b8,_local_2e8);
    local_158 = vpermps_avx2(_DAT_01fec480,auVar13);
    local_d8._0_4_ = auVar11._0_4_ + auVar269._0_4_;
    local_d8._4_4_ = auVar11._4_4_ + auVar269._4_4_;
    local_d8._8_4_ = auVar11._8_4_ + auVar269._8_4_;
    local_d8._12_4_ = auVar11._12_4_ + auVar269._12_4_;
    local_d8._16_4_ = auVar269._16_4_ + 0.0;
    local_d8._20_4_ = auVar269._20_4_ + 0.0;
    local_d8._24_4_ = auVar269._24_4_ + 0.0;
    local_d8._28_4_ = 0;
    auVar142 = ZEXT3264(local_d8);
    auVar253 = ZEXT1632(auVar11);
    auVar13 = vsubps_avx(auVar253,auVar269);
    auVar16 = vpermps_avx2(_DAT_01fec480,auVar13);
    fVar93 = auVar247._0_4_;
    local_118 = fVar93 + local_118;
    fVar61 = auVar247._4_4_;
    fStack_114 = fVar61 + fStack_114;
    fVar144 = auVar247._8_4_;
    fStack_110 = fVar144 + fStack_110;
    fVar220 = auVar247._12_4_;
    fStack_10c = fVar220 + fStack_10c;
    fStack_108 = fStack_108 + 0.0;
    fStack_104 = fStack_104 + 0.0;
    fStack_100 = fStack_100 + 0.0;
    auVar13 = vsubps_avx(ZEXT1632(auVar247),auVar27);
    local_f8 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar28._4_4_ = fVar91 * fVar192;
    auVar28._0_4_ = fVar59 * fVar178;
    auVar28._8_4_ = fVar120 * fVar193;
    auVar28._12_4_ = fVar92 * fVar194;
    auVar28._16_4_ = fVar143 * 0.0;
    auVar28._20_4_ = fVar161 * 0.0;
    auVar28._24_4_ = fVar162 * 0.0;
    auVar28._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar28,local_78,auVar89);
    fStack_11c = fStack_2cc + 0.0;
    auVar29._4_4_ = fStack_134 * fVar192;
    auVar29._0_4_ = local_138 * fVar178;
    auVar29._8_4_ = fStack_130 * fVar193;
    auVar29._12_4_ = fStack_12c * fVar194;
    auVar29._16_4_ = fStack_128 * fVar143;
    auVar29._20_4_ = fStack_124 * fVar161;
    auVar29._24_4_ = fStack_120 * fVar162;
    auVar29._28_4_ = 0;
    auVar9 = vfnmadd231ps_fma(auVar29,auVar89,local_3a8);
    auVar30._4_4_ = local_158._4_4_ * fVar192;
    auVar30._0_4_ = local_158._0_4_ * fVar178;
    auVar30._8_4_ = local_158._8_4_ * fVar193;
    auVar30._12_4_ = local_158._12_4_ * fVar194;
    auVar30._16_4_ = local_158._16_4_ * fVar143;
    auVar30._20_4_ = local_158._20_4_ * fVar161;
    auVar30._24_4_ = local_158._24_4_ * fVar162;
    auVar30._28_4_ = fStack_2cc + 0.0;
    auVar127 = vfnmadd231ps_fma(auVar30,local_98,auVar89);
    auVar31._4_4_ = (float)local_518._4_4_ * fVar192;
    auVar31._0_4_ = (float)local_518._0_4_ * fVar178;
    auVar31._8_4_ = (float)uStack_510 * fVar193;
    auVar31._12_4_ = uStack_510._4_4_ * fVar194;
    auVar31._16_4_ = (float)uStack_508 * fVar143;
    auVar31._20_4_ = uStack_508._4_4_ * fVar161;
    auVar31._24_4_ = (float)uStack_500 * fVar162;
    auVar31._28_4_ = uStack_500._4_4_;
    auVar10 = vfnmadd231ps_fma(auVar31,local_318,auVar89);
    auVar204._0_4_ = fVar93 * fVar178;
    auVar204._4_4_ = fVar61 * fVar192;
    auVar204._8_4_ = fVar144 * fVar193;
    auVar204._12_4_ = fVar220 * fVar194;
    auVar204._16_4_ = fVar143 * 0.0;
    auVar204._20_4_ = fVar161 * 0.0;
    auVar204._24_4_ = fVar162 * 0.0;
    auVar204._28_4_ = 0;
    auVar11 = vfnmadd231ps_fma(auVar204,auVar253,auVar89);
    uStack_fc = 0x40400000;
    auVar32._4_4_ = fStack_114 * fVar192;
    auVar32._0_4_ = local_118 * fVar178;
    auVar32._8_4_ = fStack_110 * fVar193;
    auVar32._12_4_ = fStack_10c * fVar194;
    auVar32._16_4_ = fStack_108 * fVar143;
    auVar32._20_4_ = fStack_104 * fVar161;
    auVar32._24_4_ = fStack_100 * fVar162;
    auVar32._28_4_ = local_318._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar32,local_d8,auVar89);
    auVar33._4_4_ = local_f8._4_4_ * fVar192;
    auVar33._0_4_ = local_f8._0_4_ * fVar178;
    auVar33._8_4_ = local_f8._8_4_ * fVar193;
    auVar33._12_4_ = local_f8._12_4_ * fVar194;
    auVar33._16_4_ = local_f8._16_4_ * fVar143;
    auVar33._20_4_ = local_f8._20_4_ * fVar161;
    auVar33._24_4_ = local_f8._24_4_ * fVar162;
    auVar33._28_4_ = local_f8._28_4_;
    _local_2e8 = auVar16;
    auVar64 = vfnmadd231ps_fma(auVar33,auVar16,auVar89);
    auVar34._4_4_ = local_1f8._4_4_ * fVar192;
    auVar34._0_4_ = local_1f8._0_4_ * fVar178;
    auVar34._8_4_ = local_1f8._8_4_ * fVar193;
    auVar34._12_4_ = local_1f8._12_4_ * fVar194;
    auVar34._16_4_ = local_1f8._16_4_ * fVar143;
    auVar34._20_4_ = local_1f8._20_4_ * fVar161;
    auVar34._24_4_ = local_1f8._24_4_ * fVar162;
    auVar34._28_4_ = auVar88._28_4_ + auVar14._28_4_;
    auVar237 = vfnmadd231ps_fma(auVar34,_local_338,auVar89);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
    auVar88 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
    auVar14 = vminps_avx(ZEXT1632(auVar127),ZEXT1632(auVar10));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar127),ZEXT1632(auVar10));
    auVar88 = vmaxps_avx(auVar88,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
    auVar8 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar237));
    auVar15 = vminps_avx(auVar15,auVar8);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar237));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar88,auVar13);
    auVar47._4_4_ = fStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = fStack_1b0;
    auVar47._12_4_ = fStack_1ac;
    auVar47._16_4_ = fStack_1a8;
    auVar47._20_4_ = fStack_1a4;
    auVar47._24_4_ = fStack_1a0;
    auVar47._28_4_ = fStack_19c;
    auVar88 = vcmpps_avx(auVar15,auVar47,2);
    auVar45._4_4_ = uStack_1d4;
    auVar45._0_4_ = local_1d8;
    auVar45._8_4_ = uStack_1d0;
    auVar45._12_4_ = uStack_1cc;
    auVar45._16_4_ = uStack_1c8;
    auVar45._20_4_ = uStack_1c4;
    auVar45._24_4_ = uStack_1c0;
    auVar45._28_4_ = uStack_1bc;
    auVar13 = vcmpps_avx(auVar13,auVar45,5);
    auVar88 = vandps_avx(auVar13,auVar88);
    auVar13 = local_178 & auVar88;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_318,local_78);
      auVar14 = vsubps_avx(_local_338,auVar253);
      fVar192 = auVar13._0_4_ + auVar14._0_4_;
      fVar193 = auVar13._4_4_ + auVar14._4_4_;
      fVar194 = auVar13._8_4_ + auVar14._8_4_;
      fVar143 = auVar13._12_4_ + auVar14._12_4_;
      fVar161 = auVar13._16_4_ + auVar14._16_4_;
      fVar162 = auVar13._20_4_ + auVar14._20_4_;
      fVar163 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_518,local_b8);
      auVar8 = vsubps_avx(local_1f8,ZEXT1632(auVar247));
      auVar110._0_4_ = auVar15._0_4_ + auVar8._0_4_;
      auVar110._4_4_ = auVar15._4_4_ + auVar8._4_4_;
      auVar110._8_4_ = auVar15._8_4_ + auVar8._8_4_;
      auVar110._12_4_ = auVar15._12_4_ + auVar8._12_4_;
      auVar110._16_4_ = auVar15._16_4_ + auVar8._16_4_;
      auVar110._20_4_ = auVar15._20_4_ + auVar8._20_4_;
      auVar110._24_4_ = auVar15._24_4_ + auVar8._24_4_;
      fVar178 = auVar8._28_4_;
      auVar110._28_4_ = auVar15._28_4_ + fVar178;
      auVar35._4_4_ = fVar91 * fVar193;
      auVar35._0_4_ = fVar59 * fVar192;
      auVar35._8_4_ = fVar120 * fVar194;
      auVar35._12_4_ = fVar92 * fVar143;
      auVar35._16_4_ = fVar161 * 0.0;
      auVar35._20_4_ = fVar162 * 0.0;
      auVar35._24_4_ = fVar163 * 0.0;
      auVar35._28_4_ = local_338._28_4_;
      auVar11 = vfnmadd231ps_fma(auVar35,auVar110,local_78);
      auVar36._4_4_ = fVar193 * fStack_134;
      auVar36._0_4_ = fVar192 * local_138;
      auVar36._8_4_ = fVar194 * fStack_130;
      auVar36._12_4_ = fVar143 * fStack_12c;
      auVar36._16_4_ = fVar161 * fStack_128;
      auVar36._20_4_ = fVar162 * fStack_124;
      auVar36._24_4_ = fVar163 * fStack_120;
      auVar36._28_4_ = 0;
      auVar12 = vfnmadd213ps_fma(local_3a8,auVar110,auVar36);
      auVar37._4_4_ = fVar193 * local_158._4_4_;
      auVar37._0_4_ = fVar192 * local_158._0_4_;
      auVar37._8_4_ = fVar194 * local_158._8_4_;
      auVar37._12_4_ = fVar143 * local_158._12_4_;
      auVar37._16_4_ = fVar161 * local_158._16_4_;
      auVar37._20_4_ = fVar162 * local_158._20_4_;
      auVar37._24_4_ = fVar163 * local_158._24_4_;
      auVar37._28_4_ = 0;
      auVar9 = vfnmadd213ps_fma(local_98,auVar110,auVar37);
      auVar38._4_4_ = (float)local_518._4_4_ * fVar193;
      auVar38._0_4_ = (float)local_518._0_4_ * fVar192;
      auVar38._8_4_ = (float)uStack_510 * fVar194;
      auVar38._12_4_ = uStack_510._4_4_ * fVar143;
      auVar38._16_4_ = (float)uStack_508 * fVar161;
      auVar38._20_4_ = uStack_508._4_4_ * fVar162;
      auVar38._24_4_ = (float)uStack_500 * fVar163;
      auVar38._28_4_ = 0;
      auVar247 = vfnmadd231ps_fma(auVar38,auVar110,local_318);
      auVar131._0_4_ = fVar93 * fVar192;
      auVar131._4_4_ = fVar61 * fVar193;
      auVar131._8_4_ = fVar144 * fVar194;
      auVar131._12_4_ = fVar220 * fVar143;
      auVar131._16_4_ = fVar161 * 0.0;
      auVar131._20_4_ = fVar162 * 0.0;
      auVar131._24_4_ = fVar163 * 0.0;
      auVar131._28_4_ = 0;
      auVar65 = vfnmadd231ps_fma(auVar131,auVar110,auVar253);
      auVar39._4_4_ = fVar193 * fStack_114;
      auVar39._0_4_ = fVar192 * local_118;
      auVar39._8_4_ = fVar194 * fStack_110;
      auVar39._12_4_ = fVar143 * fStack_10c;
      auVar39._16_4_ = fVar161 * fStack_108;
      auVar39._20_4_ = fVar162 * fStack_104;
      auVar39._24_4_ = fVar163 * fStack_100;
      auVar39._28_4_ = fVar178;
      auVar127 = vfnmadd213ps_fma(local_d8,auVar110,auVar39);
      auVar40._4_4_ = fVar193 * local_f8._4_4_;
      auVar40._0_4_ = fVar192 * local_f8._0_4_;
      auVar40._8_4_ = fVar194 * local_f8._8_4_;
      auVar40._12_4_ = fVar143 * local_f8._12_4_;
      auVar40._16_4_ = fVar161 * local_f8._16_4_;
      auVar40._20_4_ = fVar162 * local_f8._20_4_;
      auVar40._24_4_ = fVar163 * local_f8._24_4_;
      auVar40._28_4_ = fVar178;
      auVar10 = vfnmadd213ps_fma(auVar16,auVar110,auVar40);
      auVar142 = ZEXT1664(auVar10);
      auVar41._4_4_ = local_1f8._4_4_ * fVar193;
      auVar41._0_4_ = local_1f8._0_4_ * fVar192;
      auVar41._8_4_ = local_1f8._8_4_ * fVar194;
      auVar41._12_4_ = local_1f8._12_4_ * fVar143;
      auVar41._16_4_ = local_1f8._16_4_ * fVar161;
      auVar41._20_4_ = local_1f8._20_4_ * fVar162;
      auVar41._24_4_ = local_1f8._24_4_ * fVar163;
      auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar64 = vfnmadd231ps_fma(auVar41,auVar110,_local_338);
      auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar247));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar247));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar8 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar127));
      auVar14 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar127));
      auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
      auVar8 = vminps_avx(auVar8,auVar16);
      auVar8 = vminps_avx(auVar15,auVar8);
      auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar48._4_4_ = fStack_1b4;
      auVar48._0_4_ = local_1b8;
      auVar48._8_4_ = fStack_1b0;
      auVar48._12_4_ = fStack_1ac;
      auVar48._16_4_ = fStack_1a8;
      auVar48._20_4_ = fStack_1a4;
      auVar48._24_4_ = fStack_1a0;
      auVar48._28_4_ = fStack_19c;
      auVar13 = vcmpps_avx(auVar8,auVar48,2);
      auVar46._4_4_ = uStack_1d4;
      auVar46._0_4_ = local_1d8;
      auVar46._8_4_ = uStack_1d0;
      auVar46._12_4_ = uStack_1cc;
      auVar46._16_4_ = uStack_1c8;
      auVar46._20_4_ = uStack_1c4;
      auVar46._24_4_ = uStack_1c0;
      auVar46._28_4_ = uStack_1bc;
      auVar14 = vcmpps_avx(auVar14,auVar46,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar88 = vandps_avx(auVar88,local_178);
      auVar14 = auVar88 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar88 = vandps_avx(auVar13,auVar88);
        uVar58 = vmovmskps_avx(auVar88);
        if (uVar58 != 0) {
          auStack_2c8[uVar52] = uVar58 & 0xff;
          uVar94 = vmovlps_avx(local_238);
          *(undefined8 *)(&uStack_198 + uVar52 * 2) = uVar94;
          uVar57 = vmovlps_avx(local_538);
          auStack_58[uVar52] = uVar57;
          uVar52 = (ulong)((int)uVar52 + 1);
        }
      }
    }
    _local_518 = auVar18;
    if ((int)uVar52 != 0) {
      do {
        auVar242 = ZEXT1664(local_4f8);
        auVar232 = ZEXT1664(local_4e8);
        auVar205 = ZEXT1664(local_4c8);
        auVar177 = ZEXT1664(local_4d8);
        uVar50 = (int)uVar52 - 1;
        uVar53 = (ulong)uVar50;
        uVar56 = auStack_2c8[uVar53];
        uVar58 = (&uStack_198)[uVar53 * 2];
        fVar59 = afStack_194[uVar53 * 2];
        iVar17 = 0;
        for (uVar57 = (ulong)uVar56; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
          iVar17 = iVar17 + 1;
        }
        uVar56 = uVar56 - 1 & uVar56;
        if (uVar56 == 0) {
          uVar52 = (ulong)uVar50;
        }
        local_538._8_8_ = 0;
        local_538._0_8_ = auStack_58[uVar53];
        auVar254 = ZEXT1664(local_538);
        auStack_2c8[uVar53] = uVar56;
        fVar91 = (float)(iVar17 + 1) * 0.14285715;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar17 * 0.14285715)),
                                  ZEXT416(uVar58),ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)))
        ;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar91)),ZEXT416(uVar58),
                                 ZEXT416((uint)(1.0 - fVar91)));
        fVar91 = auVar9._0_4_;
        auVar190._0_4_ = auVar12._0_4_;
        fVar59 = fVar91 - auVar190._0_4_;
        if (0.16666667 <= fVar59) {
          auVar12 = vinsertps_avx(auVar12,auVar9,0x10);
          auVar262 = ZEXT1664(auVar12);
          auVar160 = ZEXT1664(local_3b8);
          auVar191 = ZEXT1664(local_3c8);
          auVar219 = ZEXT1664(local_3d8);
          auVar142 = ZEXT1664(_local_3e8);
          goto LAB_015f6e0a;
        }
        auVar127 = vshufps_avx(local_538,local_538,0x50);
        auVar98._8_4_ = 0x3f800000;
        auVar98._0_8_ = 0x3f8000003f800000;
        auVar98._12_4_ = 0x3f800000;
        auVar10 = vsubps_avx(auVar98,auVar127);
        fVar120 = auVar127._0_4_;
        auVar137._0_4_ = fVar120 * (float)local_3e8._0_4_;
        fVar92 = auVar127._4_4_;
        auVar137._4_4_ = fVar92 * (float)local_3e8._4_4_;
        fVar93 = auVar127._8_4_;
        auVar137._8_4_ = fVar93 * fStack_3e0;
        fVar61 = auVar127._12_4_;
        auVar137._12_4_ = fVar61 * fStack_3dc;
        auVar150._0_4_ = local_4d8._0_4_ * fVar120;
        auVar150._4_4_ = local_4d8._4_4_ * fVar92;
        auVar150._8_4_ = local_4d8._8_4_ * fVar93;
        auVar150._12_4_ = local_4d8._12_4_ * fVar61;
        auVar173._0_4_ = local_4e8._0_4_ * fVar120;
        auVar173._4_4_ = local_4e8._4_4_ * fVar92;
        auVar173._8_4_ = local_4e8._8_4_ * fVar93;
        auVar173._12_4_ = local_4e8._12_4_ * fVar61;
        auVar77._0_4_ = local_4f8._0_4_ * fVar120;
        auVar77._4_4_ = local_4f8._4_4_ * fVar92;
        auVar77._8_4_ = local_4f8._8_4_ * fVar93;
        auVar77._12_4_ = local_4f8._12_4_ * fVar61;
        auVar127 = vfmadd231ps_fma(auVar137,auVar10,local_4c8);
        auVar11 = vfmadd231ps_fma(auVar150,auVar10,local_3b8);
        auVar247 = vfmadd231ps_fma(auVar173,auVar10,local_3c8);
        auVar10 = vfmadd231ps_fma(auVar77,auVar10,local_3d8);
        auVar132._16_16_ = auVar127;
        auVar132._0_16_ = auVar127;
        auVar141._16_16_ = auVar11;
        auVar141._0_16_ = auVar11;
        auVar159._16_16_ = auVar247;
        auVar159._0_16_ = auVar247;
        _local_518 = auVar12;
        auVar190._4_4_ = auVar190._0_4_;
        auVar190._8_4_ = auVar190._0_4_;
        auVar190._12_4_ = auVar190._0_4_;
        local_3a8._0_16_ = auVar9;
        auVar190._20_4_ = fVar91;
        auVar190._16_4_ = fVar91;
        auVar190._24_4_ = fVar91;
        auVar190._28_4_ = fVar91;
        auVar88 = vsubps_avx(auVar141,auVar132);
        auVar11 = vfmadd213ps_fma(auVar88,auVar190,auVar132);
        auVar88 = vsubps_avx(auVar159,auVar141);
        auVar65 = vfmadd213ps_fma(auVar88,auVar190,auVar141);
        auVar127 = vsubps_avx(auVar10,auVar247);
        auVar90._16_16_ = auVar127;
        auVar90._0_16_ = auVar127;
        auVar127 = vfmadd213ps_fma(auVar90,auVar190,auVar159);
        auVar88 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar11));
        auVar10 = vfmadd213ps_fma(auVar88,auVar190,ZEXT1632(auVar11));
        auVar88 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar65));
        auVar127 = vfmadd213ps_fma(auVar88,auVar190,ZEXT1632(auVar65));
        auVar88 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar10));
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar88,auVar190);
        fVar220 = auVar88._4_4_ * 3.0;
        local_318._0_4_ = fVar59;
        fVar120 = fVar59 * 0.33333334;
        auVar99._0_8_ =
             CONCAT44(auVar96._4_4_ + fVar120 * fVar220,
                      auVar96._0_4_ + fVar120 * auVar88._0_4_ * 3.0);
        auVar99._8_4_ = auVar96._8_4_ + fVar120 * auVar88._8_4_ * 3.0;
        auVar99._12_4_ = auVar96._12_4_ + fVar120 * auVar88._12_4_ * 3.0;
        auVar10 = vshufpd_avx(auVar96,auVar96,3);
        auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_338 = auVar10;
        auVar127 = vsubps_avx(auVar10,auVar96);
        auVar247 = vsubps_avx(auVar11,(undefined1  [16])0x0);
        auVar78._0_4_ = auVar127._0_4_ + auVar247._0_4_;
        auVar78._4_4_ = auVar127._4_4_ + auVar247._4_4_;
        auVar78._8_4_ = auVar127._8_4_ + auVar247._8_4_;
        auVar78._12_4_ = auVar127._12_4_ + auVar247._12_4_;
        auVar127 = vshufps_avx(auVar96,auVar96,0xb1);
        auVar247 = vshufps_avx(auVar99,auVar99,0xb1);
        auVar265._4_4_ = auVar78._0_4_;
        auVar265._0_4_ = auVar78._0_4_;
        auVar265._8_4_ = auVar78._0_4_;
        auVar265._12_4_ = auVar78._0_4_;
        auVar65 = vshufps_avx(auVar78,auVar78,0x55);
        fVar92 = auVar65._0_4_;
        auVar79._0_4_ = fVar92 * auVar127._0_4_;
        fVar93 = auVar65._4_4_;
        auVar79._4_4_ = fVar93 * auVar127._4_4_;
        fVar61 = auVar65._8_4_;
        auVar79._8_4_ = fVar61 * auVar127._8_4_;
        fVar144 = auVar65._12_4_;
        auVar79._12_4_ = fVar144 * auVar127._12_4_;
        auVar151._0_4_ = fVar92 * auVar247._0_4_;
        auVar151._4_4_ = fVar93 * auVar247._4_4_;
        auVar151._8_4_ = fVar61 * auVar247._8_4_;
        auVar151._12_4_ = fVar144 * auVar247._12_4_;
        auVar64 = vfmadd231ps_fma(auVar79,auVar265,auVar96);
        _local_2e8 = auVar99;
        auVar237 = vfmadd231ps_fma(auVar151,auVar265,auVar99);
        auVar247 = vshufps_avx(auVar64,auVar64,0xe8);
        auVar65 = vshufps_avx(auVar237,auVar237,0xe8);
        auVar127 = vcmpps_avx(auVar247,auVar65,1);
        uVar58 = vextractps_avx(auVar127,0);
        auVar63 = auVar237;
        if ((uVar58 & 1) == 0) {
          auVar63 = auVar64;
        }
        auVar123._0_4_ = fVar120 * auVar88._16_4_ * 3.0;
        auVar123._4_4_ = fVar120 * fVar220;
        auVar123._8_4_ = fVar120 * auVar88._24_4_ * 3.0;
        auVar123._12_4_ = fVar120 * auVar142._28_4_;
        local_1f8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar123);
        auVar124 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
        auVar121 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar183._0_4_ = fVar92 * auVar124._0_4_;
        auVar183._4_4_ = fVar93 * auVar124._4_4_;
        auVar183._8_4_ = fVar61 * auVar124._8_4_;
        auVar183._12_4_ = fVar144 * auVar124._12_4_;
        auVar200._0_4_ = auVar121._0_4_ * fVar92;
        auVar200._4_4_ = auVar121._4_4_ * fVar93;
        auVar200._8_4_ = auVar121._8_4_ * fVar61;
        auVar200._12_4_ = auVar121._12_4_ * fVar144;
        auVar62 = vfmadd231ps_fma(auVar183,auVar265,local_1f8._0_16_);
        auVar95 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar265);
        auVar121 = vshufps_avx(auVar62,auVar62,0xe8);
        auVar134 = vshufps_avx(auVar95,auVar95,0xe8);
        auVar142 = ZEXT1664(auVar134);
        auVar124 = vcmpps_avx(auVar121,auVar134,1);
        uVar58 = vextractps_avx(auVar124,0);
        auVar133 = auVar95;
        if ((uVar58 & 1) == 0) {
          auVar133 = auVar62;
        }
        auVar63 = vmaxss_avx(auVar133,auVar63);
        auVar247 = vminps_avx(auVar247,auVar65);
        auVar65 = vminps_avx(auVar121,auVar134);
        auVar65 = vminps_avx(auVar247,auVar65);
        auVar127 = vshufps_avx(auVar127,auVar127,0x55);
        auVar127 = vblendps_avx(auVar127,auVar124,2);
        auVar124 = vpslld_avx(auVar127,0x1f);
        auVar127 = vshufpd_avx(auVar237,auVar237,1);
        auVar127 = vinsertps_avx(auVar127,auVar95,0x9c);
        auVar247 = vshufpd_avx(auVar64,auVar64,1);
        auVar247 = vinsertps_avx(auVar247,auVar62,0x9c);
        auVar127 = vblendvps_avx(auVar247,auVar127,auVar124);
        auVar247 = vmovshdup_avx(auVar127);
        auVar127 = vmaxss_avx(auVar247,auVar127);
        fVar61 = auVar65._0_4_;
        auVar247 = vmovshdup_avx(auVar65);
        fVar93 = auVar127._0_4_;
        fVar120 = auVar247._0_4_;
        fVar92 = auVar63._0_4_;
        if (((fVar61 < 0.0001) && (-0.0001 < fVar93)) || (fVar120 < 0.0001 && -0.0001 < fVar93)) {
LAB_015f76ca:
          auVar64 = vcmpps_avx(auVar65,_DAT_01f7aa10,1);
          auVar237 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar247 = vcmpss_avx(auVar63,ZEXT816(0) << 0x20,1);
          auVar100._8_4_ = 0x3f800000;
          auVar100._0_8_ = 0x3f8000003f800000;
          auVar100._12_4_ = 0x3f800000;
          auVar112._8_4_ = 0xbf800000;
          auVar112._0_8_ = 0xbf800000bf800000;
          auVar112._12_4_ = 0xbf800000;
          auVar247 = vblendvps_avx(auVar100,auVar112,auVar247);
          auVar64 = vblendvps_avx(auVar100,auVar112,auVar64);
          fVar220 = auVar64._0_4_;
          fVar144 = auVar247._0_4_;
          auVar247 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar220 == fVar144) && (!NAN(fVar220) && !NAN(fVar144))) {
            auVar247 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar220 == fVar144) && (!NAN(fVar220) && !NAN(fVar144))) {
            auVar237 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar64 = vmovshdup_avx(auVar64);
          fVar178 = auVar64._0_4_;
          if ((fVar220 != fVar178) || (NAN(fVar220) || NAN(fVar178))) {
            if ((fVar120 != fVar61) || (NAN(fVar120) || NAN(fVar61))) {
              auVar125._0_4_ = (float)((uint)fVar61 ^ local_3f8);
              auVar125._4_4_ = auVar65._4_4_ ^ uStack_3f4;
              auVar125._8_4_ = auVar65._8_4_ ^ uStack_3f0;
              auVar125._12_4_ = auVar65._12_4_ ^ uStack_3ec;
              auVar126._0_4_ = auVar125._0_4_ / (fVar120 - fVar61);
              auVar126._4_12_ = auVar125._4_12_;
              auVar65 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
              auVar64 = auVar65;
            }
            else {
              auVar65 = ZEXT816(0) << 0x20;
              if ((fVar61 != 0.0) || (auVar64 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar61))) {
                auVar65 = SUB6416(ZEXT464(0x7f800000),0);
                auVar64 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar247 = vminss_avx(auVar247,auVar65);
            auVar237 = vmaxss_avx(auVar64,auVar237);
          }
          auVar127 = vcmpss_avx(auVar127,ZEXT416(0),1);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar113._8_4_ = 0xbf800000;
          auVar113._0_8_ = 0xbf800000bf800000;
          auVar113._12_4_ = 0xbf800000;
          auVar127 = vblendvps_avx(auVar101,auVar113,auVar127);
          fVar120 = auVar127._0_4_;
          if ((fVar144 != fVar120) || (NAN(fVar144) || NAN(fVar120))) {
            if ((fVar93 != fVar92) || (NAN(fVar93) || NAN(fVar92))) {
              auVar80._0_4_ = (float)((uint)fVar92 ^ local_3f8);
              auVar80._4_4_ = auVar63._4_4_ ^ uStack_3f4;
              auVar80._8_4_ = auVar63._8_4_ ^ uStack_3f0;
              auVar80._12_4_ = auVar63._12_4_ ^ uStack_3ec;
              auVar128._0_4_ = auVar80._0_4_ / (fVar93 - fVar92);
              auVar128._4_12_ = auVar80._4_12_;
              auVar127 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
              auVar65 = auVar127;
            }
            else {
              auVar127 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar92 != 0.0) || (auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
                auVar127 = SUB6416(ZEXT464(0xff800000),0);
                auVar65 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar247 = vminss_avx(auVar247,auVar65);
            auVar237 = vmaxss_avx(auVar127,auVar237);
          }
          if ((fVar178 != fVar120) || (NAN(fVar178) || NAN(fVar120))) {
            auVar247 = vminss_avx(auVar247,SUB6416(ZEXT464(0x3f800000),0));
            auVar237 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar237);
          }
          auVar127 = vmaxss_avx(ZEXT816(0) << 0x40,auVar247);
          auVar247 = vminss_avx(auVar237,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar127._0_4_ <= auVar247._0_4_) {
            auVar127 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar127._0_4_ + -0.1)));
            auVar247 = vminss_avx(ZEXT416((uint)(auVar247._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar138._0_8_ = auVar96._0_8_;
            auVar138._8_8_ = auVar138._0_8_;
            auVar211._8_8_ = auVar99._0_8_;
            auVar211._0_8_ = auVar99._0_8_;
            auVar224._8_8_ = local_1f8._0_8_;
            auVar224._0_8_ = local_1f8._0_8_;
            auVar65 = vshufpd_avx(auVar99,auVar99,3);
            auVar64 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
            auVar237 = vshufps_avx(auVar127,auVar247,0);
            auVar81._8_4_ = 0x3f800000;
            auVar81._0_8_ = 0x3f8000003f800000;
            auVar81._12_4_ = 0x3f800000;
            auVar96 = vsubps_avx(auVar81,auVar237);
            local_338._0_4_ = auVar10._0_4_;
            local_338._4_4_ = auVar10._4_4_;
            fStack_330 = auVar10._8_4_;
            fStack_32c = auVar10._12_4_;
            fVar120 = auVar237._0_4_;
            auVar82._0_4_ = fVar120 * (float)local_338._0_4_;
            fVar92 = auVar237._4_4_;
            auVar82._4_4_ = fVar92 * (float)local_338._4_4_;
            fVar93 = auVar237._8_4_;
            auVar82._8_4_ = fVar93 * fStack_330;
            fVar61 = auVar237._12_4_;
            auVar82._12_4_ = fVar61 * fStack_32c;
            auVar174._0_4_ = fVar120 * auVar65._0_4_;
            auVar174._4_4_ = fVar92 * auVar65._4_4_;
            auVar174._8_4_ = fVar93 * auVar65._8_4_;
            auVar174._12_4_ = fVar61 * auVar65._12_4_;
            auVar184._0_4_ = fVar120 * auVar64._0_4_;
            auVar184._4_4_ = fVar92 * auVar64._4_4_;
            auVar184._8_4_ = fVar93 * auVar64._8_4_;
            auVar184._12_4_ = fVar61 * auVar64._12_4_;
            auVar201._0_4_ = fVar120 * auVar11._0_4_;
            auVar201._4_4_ = fVar92 * auVar11._4_4_;
            auVar201._8_4_ = fVar93 * auVar11._8_4_;
            auVar201._12_4_ = fVar61 * auVar11._12_4_;
            auVar65 = vfmadd231ps_fma(auVar82,auVar96,auVar138);
            auVar64 = vfmadd231ps_fma(auVar174,auVar96,auVar211);
            auVar237 = vfmadd231ps_fma(auVar184,auVar96,auVar224);
            auVar96 = vfmadd231ps_fma(auVar201,auVar96,ZEXT816(0));
            auVar10 = vmovshdup_avx(local_538);
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar127._0_4_)),local_538,
                                      ZEXT416((uint)(1.0 - auVar127._0_4_)));
            local_538 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar247._0_4_)),local_538,
                                        ZEXT416((uint)(1.0 - auVar247._0_4_)));
            fVar120 = 1.0 / fVar59;
            auVar127 = vsubps_avx(auVar64,auVar65);
            auVar212._0_4_ = auVar127._0_4_ * 3.0;
            auVar212._4_4_ = auVar127._4_4_ * 3.0;
            auVar212._8_4_ = auVar127._8_4_ * 3.0;
            auVar212._12_4_ = auVar127._12_4_ * 3.0;
            auVar127 = vsubps_avx(auVar237,auVar64);
            auVar225._0_4_ = auVar127._0_4_ * 3.0;
            auVar225._4_4_ = auVar127._4_4_ * 3.0;
            auVar225._8_4_ = auVar127._8_4_ * 3.0;
            auVar225._12_4_ = auVar127._12_4_ * 3.0;
            auVar127 = vsubps_avx(auVar96,auVar237);
            auVar238._0_4_ = auVar127._0_4_ * 3.0;
            auVar238._4_4_ = auVar127._4_4_ * 3.0;
            auVar238._8_4_ = auVar127._8_4_ * 3.0;
            auVar238._12_4_ = auVar127._12_4_ * 3.0;
            auVar10 = vminps_avx(auVar225,auVar238);
            auVar127 = vmaxps_avx(auVar225,auVar238);
            auVar10 = vminps_avx(auVar212,auVar10);
            auVar127 = vmaxps_avx(auVar212,auVar127);
            auVar11 = vshufpd_avx(auVar10,auVar10,3);
            auVar247 = vshufpd_avx(auVar127,auVar127,3);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar127 = vmaxps_avx(auVar127,auVar247);
            auVar226._0_4_ = auVar10._0_4_ * fVar120;
            auVar226._4_4_ = auVar10._4_4_ * fVar120;
            auVar226._8_4_ = auVar10._8_4_ * fVar120;
            auVar226._12_4_ = auVar10._12_4_ * fVar120;
            auVar213._0_4_ = auVar127._0_4_ * fVar120;
            auVar213._4_4_ = auVar127._4_4_ * fVar120;
            auVar213._8_4_ = auVar127._8_4_ * fVar120;
            auVar213._12_4_ = auVar127._12_4_ * fVar120;
            fVar120 = 1.0 / (local_538._0_4_ - auVar62._0_4_);
            auVar127 = vshufpd_avx(auVar65,auVar65,3);
            auVar10 = vshufpd_avx(auVar64,auVar64,3);
            auVar11 = vshufpd_avx(auVar237,auVar237,3);
            auVar247 = vshufpd_avx(auVar96,auVar96,3);
            auVar127 = vsubps_avx(auVar127,auVar65);
            auVar65 = vsubps_avx(auVar10,auVar64);
            auVar64 = vsubps_avx(auVar11,auVar237);
            auVar247 = vsubps_avx(auVar247,auVar96);
            auVar10 = vminps_avx(auVar127,auVar65);
            auVar127 = vmaxps_avx(auVar127,auVar65);
            auVar11 = vminps_avx(auVar64,auVar247);
            auVar11 = vminps_avx(auVar10,auVar11);
            auVar10 = vmaxps_avx(auVar64,auVar247);
            auVar127 = vmaxps_avx(auVar127,auVar10);
            auVar256._0_4_ = fVar120 * auVar11._0_4_;
            auVar256._4_4_ = fVar120 * auVar11._4_4_;
            auVar256._8_4_ = fVar120 * auVar11._8_4_;
            auVar256._12_4_ = fVar120 * auVar11._12_4_;
            auVar248._0_4_ = fVar120 * auVar127._0_4_;
            auVar248._4_4_ = fVar120 * auVar127._4_4_;
            auVar248._8_4_ = fVar120 * auVar127._8_4_;
            auVar248._12_4_ = fVar120 * auVar127._12_4_;
            auVar247 = vinsertps_avx(auVar12,auVar62,0x10);
            auVar65 = vinsertps_avx(auVar9,local_538,0x10);
            auVar239._0_4_ = (auVar247._0_4_ + auVar65._0_4_) * 0.5;
            auVar239._4_4_ = (auVar247._4_4_ + auVar65._4_4_) * 0.5;
            auVar239._8_4_ = (auVar247._8_4_ + auVar65._8_4_) * 0.5;
            auVar239._12_4_ = (auVar247._12_4_ + auVar65._12_4_) * 0.5;
            auVar83._4_4_ = auVar239._0_4_;
            auVar83._0_4_ = auVar239._0_4_;
            auVar83._8_4_ = auVar239._0_4_;
            auVar83._12_4_ = auVar239._0_4_;
            auVar127 = vfmadd213ps_fma(local_208,auVar83,local_488);
            auVar10 = vfmadd213ps_fma(local_218,auVar83,_local_528);
            auVar11 = vfmadd213ps_fma(local_228,auVar83,local_478);
            auVar9 = vsubps_avx(auVar10,auVar127);
            auVar127 = vfmadd213ps_fma(auVar9,auVar83,auVar127);
            auVar9 = vsubps_avx(auVar11,auVar10);
            auVar9 = vfmadd213ps_fma(auVar9,auVar83,auVar10);
            auVar9 = vsubps_avx(auVar9,auVar127);
            auVar127 = vfmadd231ps_fma(auVar127,auVar9,auVar83);
            auVar84._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
            auVar84._8_4_ = auVar9._8_4_ * 3.0;
            auVar84._12_4_ = auVar9._12_4_ * 3.0;
            auVar266._8_8_ = auVar127._0_8_;
            auVar266._0_8_ = auVar127._0_8_;
            auVar9 = vshufpd_avx(auVar127,auVar127,3);
            auVar127 = vshufps_avx(auVar239,auVar239,0x55);
            auVar237 = vsubps_avx(auVar9,auVar266);
            auVar63 = vfmadd231ps_fma(auVar266,auVar127,auVar237);
            auVar271._8_8_ = auVar84._0_8_;
            auVar271._0_8_ = auVar84._0_8_;
            auVar9 = vshufpd_avx(auVar84,auVar84,3);
            auVar9 = vsubps_avx(auVar9,auVar271);
            auVar96 = vfmadd213ps_fma(auVar9,auVar127,auVar271);
            auVar127 = vmovshdup_avx(auVar96);
            auVar272._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
            auVar272._8_4_ = auVar127._8_4_ ^ 0x80000000;
            auVar272._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar10 = vmovshdup_avx(auVar237);
            auVar9 = vunpcklps_avx(auVar10,auVar272);
            auVar11 = vshufps_avx(auVar9,auVar272,4);
            auVar64 = vshufps_avx(auVar239,auVar239,0x54);
            auVar129._0_8_ = auVar237._0_8_ ^ 0x8000000080000000;
            auVar129._8_4_ = auVar237._8_4_ ^ 0x80000000;
            auVar129._12_4_ = auVar237._12_4_ ^ 0x80000000;
            auVar9 = vmovlhps_avx(auVar129,auVar96);
            auVar9 = vshufps_avx(auVar9,auVar96,8);
            auVar127 = vfmsub231ss_fma(ZEXT416((uint)(auVar237._0_4_ * auVar127._0_4_)),auVar10,
                                       auVar96);
            uVar60 = auVar127._0_4_;
            auVar85._4_4_ = uVar60;
            auVar85._0_4_ = uVar60;
            auVar85._8_4_ = uVar60;
            auVar85._12_4_ = uVar60;
            auVar127 = vdivps_avx(auVar11,auVar85);
            auVar10 = vdivps_avx(auVar9,auVar85);
            fVar93 = auVar63._0_4_;
            fVar120 = auVar127._0_4_;
            auVar9 = vshufps_avx(auVar63,auVar63,0x55);
            fVar92 = auVar10._0_4_;
            auVar86._0_4_ = fVar93 * fVar120 + auVar9._0_4_ * fVar92;
            auVar86._4_4_ = fVar93 * auVar127._4_4_ + auVar9._4_4_ * auVar10._4_4_;
            auVar86._8_4_ = fVar93 * auVar127._8_4_ + auVar9._8_4_ * auVar10._8_4_;
            auVar86._12_4_ = fVar93 * auVar127._12_4_ + auVar9._12_4_ * auVar10._12_4_;
            auVar134 = vsubps_avx(auVar64,auVar86);
            auVar64 = vmovshdup_avx(auVar127);
            auVar9 = vinsertps_avx(auVar226,auVar256,0x1c);
            auVar152._0_4_ = auVar64._0_4_ * auVar9._0_4_;
            auVar152._4_4_ = auVar64._4_4_ * auVar9._4_4_;
            auVar152._8_4_ = auVar64._8_4_ * auVar9._8_4_;
            auVar152._12_4_ = auVar64._12_4_ * auVar9._12_4_;
            auVar11 = vinsertps_avx(auVar213,auVar248,0x1c);
            auVar102._0_4_ = auVar11._0_4_ * auVar64._0_4_;
            auVar102._4_4_ = auVar11._4_4_ * auVar64._4_4_;
            auVar102._8_4_ = auVar11._8_4_ * auVar64._8_4_;
            auVar102._12_4_ = auVar11._12_4_ * auVar64._12_4_;
            auVar63 = vminps_avx(auVar152,auVar102);
            auVar96 = vmaxps_avx(auVar102,auVar152);
            auVar64 = vinsertps_avx(auVar256,auVar226,0x4c);
            auVar124 = vmovshdup_avx(auVar10);
            auVar237 = vinsertps_avx(auVar248,auVar213,0x4c);
            auVar249._0_4_ = auVar124._0_4_ * auVar64._0_4_;
            auVar249._4_4_ = auVar124._4_4_ * auVar64._4_4_;
            auVar249._8_4_ = auVar124._8_4_ * auVar64._8_4_;
            auVar249._12_4_ = auVar124._12_4_ * auVar64._12_4_;
            auVar227._0_4_ = auVar124._0_4_ * auVar237._0_4_;
            auVar227._4_4_ = auVar124._4_4_ * auVar237._4_4_;
            auVar227._8_4_ = auVar124._8_4_ * auVar237._8_4_;
            auVar227._12_4_ = auVar124._12_4_ * auVar237._12_4_;
            auVar124 = vminps_avx(auVar249,auVar227);
            auVar257._0_4_ = auVar63._0_4_ + auVar124._0_4_;
            auVar257._4_4_ = auVar63._4_4_ + auVar124._4_4_;
            auVar257._8_4_ = auVar63._8_4_ + auVar124._8_4_;
            auVar257._12_4_ = auVar63._12_4_ + auVar124._12_4_;
            auVar63 = vmaxps_avx(auVar227,auVar249);
            auVar103._0_4_ = auVar63._0_4_ + auVar96._0_4_;
            auVar103._4_4_ = auVar63._4_4_ + auVar96._4_4_;
            auVar103._8_4_ = auVar63._8_4_ + auVar96._8_4_;
            auVar103._12_4_ = auVar63._12_4_ + auVar96._12_4_;
            auVar228._8_8_ = 0x3f80000000000000;
            auVar228._0_8_ = 0x3f80000000000000;
            auVar96 = vsubps_avx(auVar228,auVar103);
            auVar63 = vsubps_avx(auVar228,auVar257);
            auVar124 = vsubps_avx(auVar247,auVar239);
            auVar121 = vsubps_avx(auVar65,auVar239);
            auVar114._0_4_ = fVar120 * auVar9._0_4_;
            auVar114._4_4_ = fVar120 * auVar9._4_4_;
            auVar114._8_4_ = fVar120 * auVar9._8_4_;
            auVar114._12_4_ = fVar120 * auVar9._12_4_;
            auVar258._0_4_ = fVar120 * auVar11._0_4_;
            auVar258._4_4_ = fVar120 * auVar11._4_4_;
            auVar258._8_4_ = fVar120 * auVar11._8_4_;
            auVar258._12_4_ = fVar120 * auVar11._12_4_;
            auVar11 = vminps_avx(auVar114,auVar258);
            auVar9 = vmaxps_avx(auVar258,auVar114);
            auVar153._0_4_ = fVar92 * auVar64._0_4_;
            auVar153._4_4_ = fVar92 * auVar64._4_4_;
            auVar153._8_4_ = fVar92 * auVar64._8_4_;
            auVar153._12_4_ = fVar92 * auVar64._12_4_;
            auVar214._0_4_ = fVar92 * auVar237._0_4_;
            auVar214._4_4_ = fVar92 * auVar237._4_4_;
            auVar214._8_4_ = fVar92 * auVar237._8_4_;
            auVar214._12_4_ = fVar92 * auVar237._12_4_;
            auVar64 = vminps_avx(auVar153,auVar214);
            auVar259._0_4_ = auVar11._0_4_ + auVar64._0_4_;
            auVar259._4_4_ = auVar11._4_4_ + auVar64._4_4_;
            auVar259._8_4_ = auVar11._8_4_ + auVar64._8_4_;
            auVar259._12_4_ = auVar11._12_4_ + auVar64._12_4_;
            fVar178 = auVar124._0_4_;
            auVar267._0_4_ = fVar178 * auVar96._0_4_;
            fVar192 = auVar124._4_4_;
            auVar267._4_4_ = fVar192 * auVar96._4_4_;
            fVar193 = auVar124._8_4_;
            auVar267._8_4_ = fVar193 * auVar96._8_4_;
            fVar194 = auVar124._12_4_;
            auVar267._12_4_ = fVar194 * auVar96._12_4_;
            auVar11 = vmaxps_avx(auVar214,auVar153);
            auVar215._0_4_ = fVar178 * auVar63._0_4_;
            auVar215._4_4_ = fVar192 * auVar63._4_4_;
            auVar215._8_4_ = fVar193 * auVar63._8_4_;
            auVar215._12_4_ = fVar194 * auVar63._12_4_;
            fVar93 = auVar121._0_4_;
            auVar104._0_4_ = fVar93 * auVar96._0_4_;
            fVar61 = auVar121._4_4_;
            auVar104._4_4_ = fVar61 * auVar96._4_4_;
            fVar144 = auVar121._8_4_;
            auVar104._8_4_ = fVar144 * auVar96._8_4_;
            fVar220 = auVar121._12_4_;
            auVar104._12_4_ = fVar220 * auVar96._12_4_;
            auVar229._0_4_ = fVar93 * auVar63._0_4_;
            auVar229._4_4_ = fVar61 * auVar63._4_4_;
            auVar229._8_4_ = fVar144 * auVar63._8_4_;
            auVar229._12_4_ = fVar220 * auVar63._12_4_;
            auVar115._0_4_ = auVar9._0_4_ + auVar11._0_4_;
            auVar115._4_4_ = auVar9._4_4_ + auVar11._4_4_;
            auVar115._8_4_ = auVar9._8_4_ + auVar11._8_4_;
            auVar115._12_4_ = auVar9._12_4_ + auVar11._12_4_;
            auVar154._8_8_ = 0x3f800000;
            auVar154._0_8_ = 0x3f800000;
            auVar9 = vsubps_avx(auVar154,auVar115);
            auVar11 = vsubps_avx(auVar154,auVar259);
            auVar260._0_4_ = fVar178 * auVar9._0_4_;
            auVar260._4_4_ = fVar192 * auVar9._4_4_;
            auVar260._8_4_ = fVar193 * auVar9._8_4_;
            auVar260._12_4_ = fVar194 * auVar9._12_4_;
            auVar250._0_4_ = fVar178 * auVar11._0_4_;
            auVar250._4_4_ = fVar192 * auVar11._4_4_;
            auVar250._8_4_ = fVar193 * auVar11._8_4_;
            auVar250._12_4_ = fVar194 * auVar11._12_4_;
            auVar116._0_4_ = fVar93 * auVar9._0_4_;
            auVar116._4_4_ = fVar61 * auVar9._4_4_;
            auVar116._8_4_ = fVar144 * auVar9._8_4_;
            auVar116._12_4_ = fVar220 * auVar9._12_4_;
            auVar155._0_4_ = fVar93 * auVar11._0_4_;
            auVar155._4_4_ = fVar61 * auVar11._4_4_;
            auVar155._8_4_ = fVar144 * auVar11._8_4_;
            auVar155._12_4_ = fVar220 * auVar11._12_4_;
            auVar9 = vminps_avx(auVar260,auVar250);
            auVar11 = vminps_avx(auVar116,auVar155);
            auVar9 = vminps_avx(auVar9,auVar11);
            auVar11 = vmaxps_avx(auVar250,auVar260);
            auVar64 = vmaxps_avx(auVar155,auVar116);
            auVar237 = vminps_avx(auVar267,auVar215);
            auVar96 = vminps_avx(auVar104,auVar229);
            auVar237 = vminps_avx(auVar237,auVar96);
            auVar9 = vhaddps_avx(auVar9,auVar237);
            auVar11 = vmaxps_avx(auVar64,auVar11);
            auVar64 = vmaxps_avx(auVar215,auVar267);
            auVar237 = vmaxps_avx(auVar229,auVar104);
            auVar64 = vmaxps_avx(auVar237,auVar64);
            auVar11 = vhaddps_avx(auVar11,auVar64);
            auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
            auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
            auVar230._0_4_ = auVar134._0_4_ + auVar9._0_4_;
            auVar230._4_4_ = auVar134._4_4_ + auVar9._4_4_;
            auVar230._8_4_ = auVar134._8_4_ + auVar9._8_4_;
            auVar230._12_4_ = auVar134._12_4_ + auVar9._12_4_;
            auVar216._0_4_ = auVar134._0_4_ + auVar11._0_4_;
            auVar216._4_4_ = auVar134._4_4_ + auVar11._4_4_;
            auVar216._8_4_ = auVar134._8_4_ + auVar11._8_4_;
            auVar216._12_4_ = auVar134._12_4_ + auVar11._12_4_;
            auVar142 = ZEXT1664(auVar216);
            auVar9 = vmaxps_avx(auVar247,auVar230);
            auVar11 = vminps_avx(auVar216,auVar65);
            auVar9 = vcmpps_avx(auVar11,auVar9,1);
            auVar9 = vshufps_avx(auVar9,auVar9,0x50);
            if ((auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar9[0xf]) {
              bVar55 = 0;
              if ((auVar190._0_4_ < auVar230._0_4_) && (bVar55 = 0, auVar216._0_4_ < auVar65._0_4_))
              {
                auVar11 = vmovshdup_avx(auVar230);
                auVar9 = vcmpps_avx(auVar216,auVar65,1);
                bVar55 = auVar9[4] & auVar62._0_4_ < auVar11._0_4_;
              }
              if (((3 < (uint)uVar52 || fVar59 < 0.001) | bVar55) != 1) goto LAB_015f827a;
              lVar54 = 200;
              do {
                fVar61 = auVar134._0_4_;
                fVar93 = 1.0 - fVar61;
                fVar59 = fVar93 * fVar93 * fVar93;
                fVar91 = fVar61 * 3.0 * fVar93 * fVar93;
                fVar93 = fVar93 * fVar61 * fVar61 * 3.0;
                auVar139._4_4_ = fVar59;
                auVar139._0_4_ = fVar59;
                auVar139._8_4_ = fVar59;
                auVar139._12_4_ = fVar59;
                auVar117._4_4_ = fVar91;
                auVar117._0_4_ = fVar91;
                auVar117._8_4_ = fVar91;
                auVar117._12_4_ = fVar91;
                auVar105._4_4_ = fVar93;
                auVar105._0_4_ = fVar93;
                auVar105._8_4_ = fVar93;
                auVar105._12_4_ = fVar93;
                fVar61 = fVar61 * fVar61 * fVar61;
                auVar156._0_4_ = fVar61 * (float)local_378._0_4_;
                auVar156._4_4_ = fVar61 * (float)local_378._4_4_;
                auVar156._8_4_ = fVar61 * fStack_370;
                auVar156._12_4_ = fVar61 * fStack_36c;
                auVar12 = vfmadd231ps_fma(auVar156,auVar105,local_478);
                auVar12 = vfmadd231ps_fma(auVar12,auVar117,_local_528);
                auVar12 = vfmadd231ps_fma(auVar12,local_488,auVar139);
                auVar106._8_8_ = auVar12._0_8_;
                auVar106._0_8_ = auVar12._0_8_;
                auVar12 = vshufpd_avx(auVar12,auVar12,3);
                auVar9 = vshufps_avx(auVar134,auVar134,0x55);
                auVar12 = vsubps_avx(auVar12,auVar106);
                auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar106);
                fVar59 = auVar9._0_4_;
                auVar12 = vshufps_avx(auVar9,auVar9,0x55);
                auVar107._0_4_ = fVar120 * fVar59 + fVar92 * auVar12._0_4_;
                auVar107._4_4_ = auVar127._4_4_ * fVar59 + auVar10._4_4_ * auVar12._4_4_;
                auVar107._8_4_ = auVar127._8_4_ * fVar59 + auVar10._8_4_ * auVar12._8_4_;
                auVar107._12_4_ = auVar127._12_4_ * fVar59 + auVar10._12_4_ * auVar12._12_4_;
                auVar134 = vsubps_avx(auVar134,auVar107);
                auVar12 = vandps_avx(local_2f8,auVar9);
                auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
                auVar12 = vmaxss_avx(auVar9,auVar12);
                if (auVar12._0_4_ < (float)local_388._0_4_) {
                  fVar59 = auVar134._0_4_;
                  if ((0.0 <= fVar59) && (fVar59 <= 1.0)) {
                    auVar12 = vmovshdup_avx(auVar134);
                    fVar91 = auVar12._0_4_;
                    if ((0.0 <= fVar91) && (fVar91 <= 1.0)) {
                      auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                              ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                              0x1c);
                      auVar64 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                    [2]),0x28);
                      aVar1 = (ray->super_RayK<1>).org.field_0;
                      auVar12 = vsubps_avx(local_408,(undefined1  [16])aVar1);
                      auVar12 = vdpps_avx(auVar12,auVar64,0x7f);
                      auVar9 = vsubps_avx(local_438,(undefined1  [16])aVar1);
                      auVar9 = vdpps_avx(auVar9,auVar64,0x7f);
                      auVar127 = vsubps_avx(local_448,(undefined1  [16])aVar1);
                      auVar127 = vdpps_avx(auVar127,auVar64,0x7f);
                      auVar10 = vsubps_avx(local_428,(undefined1  [16])aVar1);
                      auVar10 = vdpps_avx(auVar10,auVar64,0x7f);
                      auVar11 = vsubps_avx(_local_418,(undefined1  [16])aVar1);
                      auVar11 = vdpps_avx(auVar11,auVar64,0x7f);
                      auVar247 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
                      auVar247 = vdpps_avx(auVar247,auVar64,0x7f);
                      auVar65 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
                      auVar65 = vdpps_avx(auVar65,auVar64,0x7f);
                      auVar44._4_4_ = fStack_494;
                      auVar44._0_4_ = local_498;
                      auVar44._8_4_ = fStack_490;
                      auVar44._12_4_ = fStack_48c;
                      auVar237 = vsubps_avx(auVar44,(undefined1  [16])aVar1);
                      auVar64 = vdpps_avx(auVar237,auVar64,0x7f);
                      fVar120 = 1.0 - fVar91;
                      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar91)),
                                                ZEXT416((uint)fVar120),auVar12);
                      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar247._0_4_ * fVar91)),
                                               ZEXT416((uint)fVar120),auVar9);
                      auVar127 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar91)),
                                                 ZEXT416((uint)fVar120),auVar127);
                      auVar142 = ZEXT1664(auVar127);
                      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * auVar64._0_4_)),
                                                ZEXT416((uint)fVar120),auVar10);
                      fVar93 = 1.0 - fVar59;
                      fVar91 = fVar93 * fVar59 * fVar59 * 3.0;
                      fVar144 = fVar59 * fVar59 * fVar59;
                      auVar127 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar144)),
                                                 ZEXT416((uint)fVar91),auVar127);
                      fVar120 = fVar59 * 3.0 * fVar93 * fVar93;
                      auVar9 = vfmadd231ss_fma(auVar127,ZEXT416((uint)fVar120),auVar9);
                      fVar92 = fVar93 * fVar93 * fVar93;
                      auVar12 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar92),auVar12);
                      fVar61 = auVar12._0_4_;
                      if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar61) &&
                          (fVar220 = (ray->super_RayK<1>).tfar, fVar61 <= fVar220)) &&
                         (pGVar4 = (context->scene->geometries).items[uVar51].ptr,
                         (pGVar4->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar12 = vshufps_avx(auVar134,auVar134,0x55);
                        auVar202._8_4_ = 0x3f800000;
                        auVar202._0_8_ = 0x3f8000003f800000;
                        auVar202._12_4_ = 0x3f800000;
                        auVar9 = vsubps_avx(auVar202,auVar12);
                        fVar178 = auVar12._0_4_;
                        auVar217._0_4_ = fVar178 * (float)local_418._0_4_;
                        fVar192 = auVar12._4_4_;
                        auVar217._4_4_ = fVar192 * (float)local_418._4_4_;
                        fVar193 = auVar12._8_4_;
                        auVar217._8_4_ = fVar193 * fStack_410;
                        fVar194 = auVar12._12_4_;
                        auVar217._12_4_ = fVar194 * fStack_40c;
                        auVar231._0_4_ = fVar178 * (float)local_458._0_4_;
                        auVar231._4_4_ = fVar192 * (float)local_458._4_4_;
                        auVar231._8_4_ = fVar193 * fStack_450;
                        auVar231._12_4_ = fVar194 * fStack_44c;
                        auVar240._0_4_ = fVar178 * (float)local_468._0_4_;
                        auVar240._4_4_ = fVar192 * (float)local_468._4_4_;
                        auVar240._8_4_ = fVar193 * fStack_460;
                        auVar240._12_4_ = fVar194 * fStack_45c;
                        auVar185._0_4_ = fVar178 * local_498;
                        auVar185._4_4_ = fVar192 * fStack_494;
                        auVar185._8_4_ = fVar193 * fStack_490;
                        auVar185._12_4_ = fVar194 * fStack_48c;
                        auVar12 = vfmadd231ps_fma(auVar217,auVar9,local_408);
                        auVar127 = vfmadd231ps_fma(auVar231,auVar9,local_438);
                        auVar10 = vfmadd231ps_fma(auVar240,auVar9,local_448);
                        auVar11 = vfmadd231ps_fma(auVar185,auVar9,local_428);
                        auVar12 = vsubps_avx(auVar127,auVar12);
                        auVar9 = vsubps_avx(auVar10,auVar127);
                        auVar142 = ZEXT1664(auVar9);
                        auVar127 = vsubps_avx(auVar11,auVar10);
                        auVar241._0_4_ = fVar59 * auVar9._0_4_;
                        auVar241._4_4_ = fVar59 * auVar9._4_4_;
                        auVar241._8_4_ = fVar59 * auVar9._8_4_;
                        auVar241._12_4_ = fVar59 * auVar9._12_4_;
                        auVar175._4_4_ = fVar93;
                        auVar175._0_4_ = fVar93;
                        auVar175._8_4_ = fVar93;
                        auVar175._12_4_ = fVar93;
                        auVar12 = vfmadd231ps_fma(auVar241,auVar175,auVar12);
                        auVar186._0_4_ = fVar59 * auVar127._0_4_;
                        auVar186._4_4_ = fVar59 * auVar127._4_4_;
                        auVar186._8_4_ = fVar59 * auVar127._8_4_;
                        auVar186._12_4_ = fVar59 * auVar127._12_4_;
                        auVar127 = vfmadd231ps_fma(auVar186,auVar175,auVar9);
                        auVar187._0_4_ = fVar59 * auVar127._0_4_;
                        auVar187._4_4_ = fVar59 * auVar127._4_4_;
                        auVar187._8_4_ = fVar59 * auVar127._8_4_;
                        auVar187._12_4_ = fVar59 * auVar127._12_4_;
                        auVar127 = vfmadd231ps_fma(auVar187,auVar175,auVar12);
                        auVar157._0_4_ = fVar144 * (float)local_278._0_4_;
                        auVar157._4_4_ = fVar144 * (float)local_278._4_4_;
                        auVar157._8_4_ = fVar144 * fStack_270;
                        auVar157._12_4_ = fVar144 * fStack_26c;
                        auVar118._4_4_ = fVar91;
                        auVar118._0_4_ = fVar91;
                        auVar118._8_4_ = fVar91;
                        auVar118._12_4_ = fVar91;
                        auVar12 = vfmadd132ps_fma(auVar118,auVar157,local_268);
                        auVar140._4_4_ = fVar120;
                        auVar140._0_4_ = fVar120;
                        auVar140._8_4_ = fVar120;
                        auVar140._12_4_ = fVar120;
                        auVar12 = vfmadd132ps_fma(auVar140,auVar12,local_258);
                        auVar158._0_4_ = auVar127._0_4_ * 3.0;
                        auVar158._4_4_ = auVar127._4_4_ * 3.0;
                        auVar158._8_4_ = auVar127._8_4_ * 3.0;
                        auVar158._12_4_ = auVar127._12_4_ * 3.0;
                        auVar130._4_4_ = fVar92;
                        auVar130._0_4_ = fVar92;
                        auVar130._8_4_ = fVar92;
                        auVar130._12_4_ = fVar92;
                        auVar127 = vfmadd132ps_fma(auVar130,auVar12,local_248);
                        auVar12 = vshufps_avx(auVar158,auVar158,0xc9);
                        auVar119._0_4_ = auVar127._0_4_ * auVar12._0_4_;
                        auVar119._4_4_ = auVar127._4_4_ * auVar12._4_4_;
                        auVar119._8_4_ = auVar127._8_4_ * auVar12._8_4_;
                        auVar119._12_4_ = auVar127._12_4_ * auVar12._12_4_;
                        auVar12 = vshufps_avx(auVar127,auVar127,0xc9);
                        auVar12 = vfmsub231ps_fma(auVar119,auVar158,auVar12);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar61;
                          auVar9 = vshufps_avx(auVar12,auVar12,0xe9);
                          uVar94 = vmovlps_avx(auVar9);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar94;
                          (ray->Ng).field_0.field_0.z = auVar12._0_4_;
                          uVar94 = vmovlps_avx(auVar134);
                          ray->u = (float)(int)uVar94;
                          ray->v = (float)(int)((ulong)uVar94 >> 0x20);
                          ray->primID = (uint)local_4a0;
                          ray->geomID = uVar51;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_518._0_4_ = fVar220;
                          auVar127 = vshufps_avx(auVar12,auVar12,0xe9);
                          local_2b8 = vmovlps_avx(auVar127);
                          local_2b0 = auVar12._0_4_;
                          local_2ac = vmovlps_avx(auVar134);
                          local_2a4 = (uint)local_4a0;
                          local_2a0 = uVar51;
                          local_29c = context->user->instID[0];
                          local_298 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar61;
                          local_53c = -1;
                          local_368.valid = &local_53c;
                          local_368.geometryUserPtr = pGVar4->userPtr;
                          local_368.context = context->user;
                          local_368.ray = (RTCRayN *)ray;
                          local_368.hit = (RTCHitN *)&local_2b8;
                          local_368.N = 1;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015f8127:
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar142 = ZEXT1664(auVar142._0_16_);
                              (*p_Var7)(&local_368);
                              if (*local_368.valid == 0) goto LAB_015f81db;
                            }
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_368.hit;
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_368.hit + 4);
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_368.hit + 8);
                            *(float *)((long)local_368.ray + 0x3c) = *(float *)(local_368.hit + 0xc)
                            ;
                            *(float *)((long)local_368.ray + 0x40) =
                                 *(float *)(local_368.hit + 0x10);
                            *(float *)((long)local_368.ray + 0x44) =
                                 *(float *)(local_368.hit + 0x14);
                            *(float *)((long)local_368.ray + 0x48) =
                                 *(float *)(local_368.hit + 0x18);
                            *(float *)((long)local_368.ray + 0x4c) =
                                 *(float *)(local_368.hit + 0x1c);
                            *(float *)((long)local_368.ray + 0x50) =
                                 *(float *)(local_368.hit + 0x20);
                          }
                          else {
                            local_538._0_8_ = context;
                            auVar142 = ZEXT1664(auVar9);
                            (*pGVar4->intersectionFilterN)(&local_368);
                            context = (RayQueryContext *)local_538._0_8_;
                            if (*local_368.valid != 0) goto LAB_015f8127;
LAB_015f81db:
                            (ray->super_RayK<1>).tfar = (float)local_518._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar54 = lVar54 + -1;
              } while (lVar54 != 0);
            }
          }
        }
        else {
          auVar247 = vcmpps_avx(auVar247,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar64 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar247 = vandps_avx(auVar64,auVar247);
          if (-0.0001 < fVar92 && (auVar247 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_015f76ca;
        }
        if ((uint)uVar52 == 0) break;
      } while( true );
    }
    fVar59 = (ray->super_RayK<1>).tfar;
    auVar87._4_4_ = fVar59;
    auVar87._0_4_ = fVar59;
    auVar87._8_4_ = fVar59;
    auVar87._12_4_ = fVar59;
    auVar12 = vcmpps_avx(local_288,auVar87,2);
    uVar51 = vmovmskps_avx(auVar12);
    uVar49 = uVar49 & (uint)local_4b0 & uVar51;
    prim = local_4a8;
    if (uVar49 == 0) {
      return;
    }
  } while( true );
LAB_015f827a:
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar91),0x10);
  auVar262 = ZEXT1664(auVar12);
  auVar12 = vinsertps_avx(auVar62,ZEXT416((uint)local_538._0_4_),0x10);
  auVar254 = ZEXT1664(auVar12);
  auVar205 = ZEXT1664(local_4c8);
  auVar160 = ZEXT1664(local_3b8);
  auVar191 = ZEXT1664(local_3c8);
  auVar219 = ZEXT1664(local_3d8);
  auVar142 = ZEXT1664(_local_3e8);
  auVar177 = ZEXT1664(local_4d8);
  auVar232 = ZEXT1664(local_4e8);
  auVar242 = ZEXT1664(local_4f8);
  goto LAB_015f6e0a;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }